

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O1

int secp256k1_ecmult_const_xonly
              (secp256k1_fe *r,secp256k1_fe *n,secp256k1_fe *d,secp256k1_scalar *q,
              int known_on_curve)

{
  uint *pk_parity;
  undefined4 *puVar1;
  byte bVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  bool bVar176;
  bool bVar177;
  uint64_t uVar178;
  secp256k1_callback *error_callback;
  int iVar179;
  int iVar180;
  uint uVar181;
  int iVar182;
  uint uVar183;
  ulong uVar184;
  long lVar185;
  FILE *__stream;
  size_t sVar186;
  secp256k1_ge *psVar187;
  secp256k1_gej *psVar188;
  secp256k1_context *ctx;
  secp256k1_scratch *scratch;
  size_t sVar189;
  secp256k1_scalar *na;
  void *pvVar190;
  void *pvVar191;
  byte *pbVar192;
  uint uVar193;
  uint uVar194;
  long lVar195;
  secp256k1_fe *psVar196;
  void *pvVar197;
  int *piVar198;
  byte *pbVar199;
  secp256k1_gej *gen;
  secp256k1_gej *gen_00;
  secp256k1_context *extraout_RDX;
  ulong uVar200;
  ulong uVar201;
  ulong uVar202;
  uint64_t *puVar203;
  secp256k1_keypair *keypair;
  secp256k1_gej *a;
  uint64_t *puVar204;
  uint64_t uVar205;
  undefined8 *puVar206;
  byte *pbVar207;
  secp256k1_gej *psVar208;
  secp256k1_fe *psVar209;
  secp256k1_context *psVar210;
  undefined8 *puVar211;
  secp256k1_context *a_00;
  int iVar212;
  ulong uVar213;
  ulong *n_points;
  _func_void_char_ptr_void_ptr *num;
  secp256k1_fe *psVar214;
  long lVar215;
  undefined4 uVar216;
  ulong unaff_R13;
  secp256k1_ge *psVar217;
  char *pcVar218;
  uchar *puVar219;
  secp256k1_ge *a_01;
  secp256k1_context *a_02;
  _func_void_char_ptr_void_ptr *p_Var220;
  undefined1 *puVar221;
  secp256k1_xonly_pubkey *psVar222;
  int iVar223;
  secp256k1_ge_storage (*pasVar224) [16];
  undefined1 *puVar225;
  bool bVar226;
  byte bVar227;
  undefined1 auVar228 [16];
  uint64_t tmp3_1;
  secp256k1_fe i;
  uint64_t tmp3_3;
  uint64_t tmp2_3;
  secp256k1_gej rj;
  secp256k1_ge p;
  ulong uStack_1cd0;
  undefined1 *puStack_1cc8;
  ulong uStack_1cc0;
  _func_void_char_ptr_void_ptr *p_Stack_1cb8;
  ulong uStack_1cb0;
  secp256k1_gej *psStack_1c98;
  int iStack_1c8c;
  secp256k1_callback *psStack_1c88;
  long lStack_1c80;
  long lStack_1c78;
  undefined1 auStack_1c70 [16];
  undefined1 auStack_1c60 [16];
  undefined1 auStack_1c50 [16];
  int iStack_1c40;
  uint64_t uStack_1c38;
  secp256k1_scalar *psStack_1c30;
  undefined4 uStack_1c28;
  uint uStack_1c24;
  undefined1 auStack_1c20 [16];
  undefined1 auStack_1c10 [16];
  int iStack_1bf4;
  undefined1 auStack_1bf0 [64];
  secp256k1_schnorrsig_extraparams sStack_1bb0;
  undefined1 auStack_1b90 [16];
  undefined1 auStack_1b80 [16];
  uint64_t uStack_1b68;
  long lStack_1b60;
  undefined8 *puStack_1b58;
  _func_void_char_ptr_void_ptr *p_Stack_1b50;
  void *pvStack_1b48;
  _func_void_char_ptr_void_ptr *p_Stack_1b40;
  ulong *puStack_1b38;
  undefined1 auStack_1b30 [16];
  undefined1 auStack_1b20 [16];
  undefined1 auStack_1b10 [16];
  undefined1 auStack_1b00 [16];
  undefined1 auStack_19d0 [32];
  uchar auStack_19b0 [32];
  undefined1 auStack_1990 [16];
  undefined1 auStack_1980 [16];
  uint64_t uStack_1970;
  undefined8 uStack_1968;
  undefined1 auStack_1960 [32];
  undefined4 uStack_1940;
  undefined4 uStack_193c;
  int iStack_1938;
  int iStack_1934;
  int iStack_1930;
  byte abStack_16b0 [8];
  undefined8 auStack_16a8 [3];
  undefined1 auStack_1690 [16];
  undefined1 auStack_1680 [16];
  undefined1 auStack_1670 [16];
  undefined1 auStack_1660 [16];
  secp256k1_context asStack_1390 [5];
  undefined1 auStack_f10 [104];
  secp256k1_context asStack_ea8 [5];
  secp256k1_ge sStack_a30;
  undefined1 auStack_9c8 [8];
  undefined1 auStack_9c0 [152];
  secp256k1_context asStack_928 [9];
  secp256k1_gej *psStack_208;
  secp256k1_fe *psStack_200;
  ulong uStack_1f8;
  secp256k1_fe *psStack_1f0;
  secp256k1_fe *psStack_1e8;
  secp256k1_gej *psStack_1e0;
  int local_1d4;
  secp256k1_fe *local_1d0;
  secp256k1_fe *local_1c8;
  ulong local_1c0;
  secp256k1_fe *local_1b8;
  secp256k1_scalar *local_1b0;
  undefined1 local_1a8 [24];
  ulong uStack_190;
  ulong local_188;
  ulong local_180;
  secp256k1_fe local_178;
  ulong local_148;
  ulong local_140;
  undefined1 local_138 [24];
  ulong uStack_120;
  uint64_t local_118;
  ulong local_110;
  undefined1 local_d8 [120];
  ulong local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  undefined8 local_40;
  undefined4 local_38;
  
  bVar227 = 0;
  psVar188 = (secp256k1_gej *)(ulong)(uint)known_on_curve;
  psStack_1e0 = (secp256k1_gej *)0x114d2f;
  psStack_1c98 = (secp256k1_gej *)n;
  psVar208 = (secp256k1_gej *)n;
  secp256k1_fe_verify(n);
  if (n->magnitude < 9) {
    psVar188 = (secp256k1_gej *)local_1a8;
    uVar202 = n->n[0];
    uVar213 = n->n[1];
    psVar214 = (secp256k1_fe *)n->n[2];
    unaff_R13 = n->n[3];
    uVar201 = n->n[4];
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar202 * 2;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = unaff_R13;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar213 * 2;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = psVar214;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar201;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar201;
    uVar184 = SUB168(auVar6 * auVar86,0);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar184 & 0xfffffffffffff;
    auVar4 = auVar5 * auVar85 + auVar4 * auVar84 + auVar7 * ZEXT816(0x1000003d10);
    uVar200 = auVar4._0_8_;
    local_138._0_8_ = uVar200 & 0xfffffffffffff;
    auVar148._8_8_ = 0;
    auVar148._0_8_ = uVar200 >> 0x34 | auVar4._8_8_ << 0xc;
    psVar196 = (secp256k1_fe *)(uVar201 * 2);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar202;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = psVar196;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar213 * 2;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = unaff_R13;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = psVar214;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = psVar214;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar184 >> 0x34 | SUB168(auVar6 * auVar86,8) << 0xc;
    auVar4 = auVar8 * auVar87 + auVar148 + auVar9 * auVar88 + auVar10 * auVar89 +
             auVar11 * ZEXT816(0x1000003d10);
    local_d8._64_8_ = auVar4._0_8_;
    auVar149._8_8_ = 0;
    auVar149._0_8_ = (ulong)local_d8._64_8_ >> 0x34 | auVar4._8_8_ << 0xc;
    local_178.n[0] = (local_d8._64_8_ & 0xfffffffffffff) >> 0x30;
    local_d8._64_8_ = local_d8._64_8_ & 0xffffffffffff;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar202;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = uVar202;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar213;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = psVar196;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = (long)psVar214 * 2;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = unaff_R13;
    auVar4 = auVar13 * auVar91 + auVar149 + auVar14 * auVar92;
    uVar201 = auVar4._0_8_;
    auVar151._8_8_ = 0;
    auVar151._0_8_ = uVar201 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = (uVar201 & 0xfffffffffffff) << 4 | local_178.n[0];
    auVar4 = auVar12 * auVar90 + ZEXT816(0x1000003d1) * auVar93;
    uVar201 = auVar4._0_8_;
    local_1a8._0_8_ = uVar201 & 0xfffffffffffff;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = uVar201 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar202 * 2;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = uVar213;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = psVar214;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = psVar196;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = unaff_R13;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = unaff_R13;
    auVar5 = auVar16 * auVar95 + auVar151 + auVar17 * auVar96;
    uVar201 = auVar5._0_8_;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar201 & 0xfffffffffffff;
    auVar4 = auVar15 * auVar94 + auVar150 + auVar18 * ZEXT816(0x1000003d10);
    uVar184 = auVar4._0_8_;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = uVar201 >> 0x34 | auVar5._8_8_ << 0xc;
    local_1a8._8_8_ = uVar184 & 0xfffffffffffff;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = uVar184 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar202 * 2;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = psVar214;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar213;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = uVar213;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = unaff_R13;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = psVar196;
    auVar153 = auVar21 * auVar99 + auVar153;
    uVar202 = auVar153._0_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar202 & 0xfffffffffffff;
    auVar4 = auVar19 * auVar97 + auVar152 + auVar20 * auVar98 + auVar22 * ZEXT816(0x1000003d10);
    uVar213 = auVar4._0_8_;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = (uVar213 >> 0x34 | auVar4._8_8_ << 0xc) + local_138._0_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar202 >> 0x34 | auVar153._8_8_ << 0xc;
    auVar154 = auVar23 * ZEXT816(0x1000003d10) + auVar154;
    uVar202 = auVar154._0_8_;
    uStack_190 = uVar202 & 0xfffffffffffff;
    local_1a8._16_8_ = uVar213 & 0xfffffffffffff;
    local_188 = (uVar202 >> 0x34 | auVar154._8_8_ << 0xc) + local_d8._64_8_;
    local_180 = 1;
    psStack_1e0 = (secp256k1_gej *)0x114fa6;
    local_1d4 = known_on_curve;
    local_1d0 = d;
    local_1c8 = n;
    local_1b8 = r;
    local_1b0 = q;
    secp256k1_fe_verify((secp256k1_fe *)psVar188);
    psStack_1e0 = (secp256k1_gej *)0x114fb4;
    secp256k1_fe_mul((secp256k1_fe *)psVar188,(secp256k1_fe *)psVar188,n);
    if (d == (secp256k1_fe *)0x0) {
      psStack_1e0 = (secp256k1_gej *)0x1153bc;
      secp256k1_fe_verify((secp256k1_fe *)local_1a8);
      local_1a8._0_8_ = local_1a8._0_8_ + 2;
      local_180 = (ulong)((int)local_180 + 1);
      psStack_1e0 = (secp256k1_gej *)0x1153d2;
      secp256k1_fe_verify((secp256k1_fe *)local_1a8);
      q = (secp256k1_scalar *)n;
      if (local_1d4 == 0) {
        psVar209 = (secp256k1_fe *)local_1a8;
LAB_001153de:
        psStack_1e0 = (secp256k1_gej *)0x1153e3;
        iVar179 = secp256k1_fe_is_square_var(psVar209);
        q = (secp256k1_scalar *)n;
        if (iVar179 == 0) {
          return 0;
        }
      }
LAB_001153eb:
      r = (secp256k1_fe *)local_1a8;
      psStack_1e0 = (secp256k1_gej *)0x115403;
      psStack_1c98 = (secp256k1_gej *)r;
      secp256k1_fe_mul((secp256k1_fe *)(local_d8 + 0x40),r,(secp256k1_fe *)q);
      psStack_1e0 = (secp256k1_gej *)0x11540b;
      psVar208 = (secp256k1_gej *)r;
      secp256k1_fe_verify(r);
      n = psVar214;
      if (8 < (int)local_180) goto LAB_0011596c;
      psVar188 = (secp256k1_gej *)(local_d8 + 0x70);
      n = (secp256k1_fe *)local_1a8._16_8_;
      unaff_R13 = uStack_190;
      q = (secp256k1_scalar *)0xfffffffffffff;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_1a8._0_8_ * 2;
      auVar116._8_8_ = 0;
      auVar116._0_8_ = uStack_190;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_1a8._8_8_ * 2;
      auVar117._8_8_ = 0;
      auVar117._0_8_ = local_1a8._16_8_;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = local_188;
      auVar118._8_8_ = 0;
      auVar118._0_8_ = local_188;
      uVar202 = SUB168(auVar46 * auVar118,0);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar202 & 0xfffffffffffff;
      auVar4 = auVar45 * auVar117 + auVar44 * auVar116 + auVar47 * ZEXT816(0x1000003d10);
      uVar213 = auVar4._0_8_;
      local_138._0_8_ = uVar213 & 0xfffffffffffff;
      auVar162._8_8_ = 0;
      auVar162._0_8_ = uVar213 >> 0x34 | auVar4._8_8_ << 0xc;
      psVar196 = (secp256k1_fe *)(local_188 * 2);
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_1a8._0_8_;
      auVar119._8_8_ = 0;
      auVar119._0_8_ = psVar196;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = local_1a8._8_8_ * 2;
      auVar120._8_8_ = 0;
      auVar120._0_8_ = uStack_190;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = local_1a8._16_8_;
      auVar121._8_8_ = 0;
      auVar121._0_8_ = local_1a8._16_8_;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar202 >> 0x34 | SUB168(auVar46 * auVar118,8) << 0xc;
      auVar4 = auVar48 * auVar119 + auVar162 + auVar49 * auVar120 + auVar50 * auVar121 +
               auVar51 * ZEXT816(0x1000003d10);
      uVar202 = auVar4._0_8_;
      auVar163._8_8_ = 0;
      auVar163._0_8_ = uVar202 >> 0x34 | auVar4._8_8_ << 0xc;
      local_1c0 = (uVar202 & 0xfffffffffffff) >> 0x30;
      psStack_1c98 = (secp256k1_gej *)(uVar202 & 0xffffffffffff);
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_1a8._0_8_;
      auVar122._8_8_ = 0;
      auVar122._0_8_ = local_1a8._0_8_;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = local_1a8._8_8_;
      auVar123._8_8_ = 0;
      auVar123._0_8_ = psVar196;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = local_1a8._16_8_ * 2;
      auVar124._8_8_ = 0;
      auVar124._0_8_ = uStack_190;
      auVar4 = auVar53 * auVar123 + auVar163 + auVar54 * auVar124;
      uVar202 = auVar4._0_8_;
      auVar165._8_8_ = 0;
      auVar165._0_8_ = uVar202 >> 0x34 | auVar4._8_8_ << 0xc;
      auVar125._8_8_ = 0;
      auVar125._0_8_ = (uVar202 & 0xfffffffffffff) << 4 | local_1c0;
      auVar4 = auVar52 * auVar122 + ZEXT816(0x1000003d1) * auVar125;
      uVar202 = auVar4._0_8_;
      local_d8._112_8_ = uVar202 & 0xfffffffffffff;
      auVar164._8_8_ = 0;
      auVar164._0_8_ = uVar202 >> 0x34 | auVar4._8_8_ << 0xc;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = local_1a8._0_8_ * 2;
      auVar126._8_8_ = 0;
      auVar126._0_8_ = local_1a8._8_8_;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = local_1a8._16_8_;
      auVar127._8_8_ = 0;
      auVar127._0_8_ = psVar196;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uStack_190;
      auVar128._8_8_ = 0;
      auVar128._0_8_ = uStack_190;
      auVar5 = auVar56 * auVar127 + auVar165 + auVar57 * auVar128;
      uVar202 = auVar5._0_8_;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar202 & 0xfffffffffffff;
      auVar4 = auVar55 * auVar126 + auVar164 + auVar58 * ZEXT816(0x1000003d10);
      uVar213 = auVar4._0_8_;
      auVar167._8_8_ = 0;
      auVar167._0_8_ = uVar202 >> 0x34 | auVar5._8_8_ << 0xc;
      local_60 = uVar213 & 0xfffffffffffff;
      auVar166._8_8_ = 0;
      auVar166._0_8_ = uVar213 >> 0x34 | auVar4._8_8_ << 0xc;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_1a8._0_8_ * 2;
      auVar129._8_8_ = 0;
      auVar129._0_8_ = local_1a8._16_8_;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = local_1a8._8_8_;
      auVar130._8_8_ = 0;
      auVar130._0_8_ = local_1a8._8_8_;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uStack_190;
      auVar131._8_8_ = 0;
      auVar131._0_8_ = psVar196;
      auVar167 = auVar61 * auVar131 + auVar167;
      uVar202 = auVar167._0_8_;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar202 & 0xfffffffffffff;
      auVar4 = auVar59 * auVar129 + auVar166 + auVar60 * auVar130 + auVar62 * ZEXT816(0x1000003d10);
      uVar213 = auVar4._0_8_;
      r = (secp256k1_fe *)(uVar202 >> 0x34 | auVar167._8_8_ << 0xc);
      local_58 = uVar213 & 0xfffffffffffff;
      auVar168._8_8_ = 0;
      auVar168._0_8_ = (uVar213 >> 0x34 | auVar4._8_8_ << 0xc) + local_138._0_8_;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = r;
      auVar168 = auVar63 * ZEXT816(0x1000003d10) + auVar168;
      uVar202 = auVar168._0_8_;
      local_50 = uVar202 & 0xfffffffffffff;
      local_48 = (long)(psStack_1c98->x).n + (uVar202 >> 0x34 | auVar168._8_8_ << 0xc);
      local_40 = 1;
      psStack_1e0 = (secp256k1_gej *)0x11565b;
      psVar208 = psVar188;
      local_178.n[0] = (uint64_t)psStack_1c98;
      secp256k1_fe_verify((secp256k1_fe *)psVar188);
      local_38 = 0;
      if (*local_1b0 == 0) goto LAB_00115971;
      r = (secp256k1_fe *)local_138;
      psStack_1c98 = (secp256k1_gej *)(local_d8 + 0x40);
      psStack_1e0 = (secp256k1_gej *)0x115688;
      secp256k1_ecmult_const((secp256k1_gej *)r,(secp256k1_ge *)psStack_1c98,local_1b0);
      psStack_1e0 = (secp256k1_gej *)0x115690;
      psVar208 = (secp256k1_gej *)r;
      secp256k1_gej_verify((secp256k1_gej *)r);
      if (local_d8._48_4_ != 0) goto LAB_00115976;
      r = (secp256k1_fe *)local_d8;
      psStack_1e0 = (secp256k1_gej *)0x1156ad;
      psVar208 = (secp256k1_gej *)r;
      secp256k1_fe_verify(r);
      if ((int)local_d8._40_4_ < 9) {
        auVar64._8_8_ = 0;
        auVar64._0_8_ = local_d8._0_8_ * 2;
        auVar132._8_8_ = 0;
        auVar132._0_8_ = local_d8._24_8_;
        auVar65._8_8_ = 0;
        auVar65._0_8_ = local_d8._8_8_ * 2;
        auVar133._8_8_ = 0;
        auVar133._0_8_ = local_d8._16_8_;
        auVar66._8_8_ = 0;
        auVar66._0_8_ = local_d8._32_8_;
        auVar134._8_8_ = 0;
        auVar134._0_8_ = local_d8._32_8_;
        uVar213 = SUB168(auVar66 * auVar134,0);
        auVar67._8_8_ = 0;
        auVar67._0_8_ = uVar213 & 0xfffffffffffff;
        auVar4 = auVar65 * auVar133 + auVar64 * auVar132 + auVar67 * ZEXT816(0x1000003d10);
        uVar202 = auVar4._0_8_;
        local_1c0 = uVar202 & 0xfffffffffffff;
        auVar169._8_8_ = 0;
        auVar169._0_8_ = uVar202 >> 0x34 | auVar4._8_8_ << 0xc;
        uVar202 = local_d8._32_8_ * 2;
        auVar68._8_8_ = 0;
        auVar68._0_8_ = local_d8._0_8_;
        auVar135._8_8_ = 0;
        auVar135._0_8_ = uVar202;
        auVar69._8_8_ = 0;
        auVar69._0_8_ = local_d8._8_8_ * 2;
        auVar136._8_8_ = 0;
        auVar136._0_8_ = local_d8._24_8_;
        auVar70._8_8_ = 0;
        auVar70._0_8_ = local_d8._16_8_;
        auVar137._8_8_ = 0;
        auVar137._0_8_ = local_d8._16_8_;
        auVar71._8_8_ = 0;
        auVar71._0_8_ = uVar213 >> 0x34 | SUB168(auVar66 * auVar134,8) << 0xc;
        auVar4 = auVar68 * auVar135 + auVar169 + auVar69 * auVar136 + auVar70 * auVar137 +
                 auVar71 * ZEXT816(0x1000003d10);
        local_140 = auVar4._0_8_;
        auVar170._8_8_ = 0;
        auVar170._0_8_ = local_140 >> 0x34 | auVar4._8_8_ << 0xc;
        local_148 = (local_140 & 0xfffffffffffff) >> 0x30;
        local_140 = local_140 & 0xffffffffffff;
        auVar72._8_8_ = 0;
        auVar72._0_8_ = local_d8._0_8_;
        auVar138._8_8_ = 0;
        auVar138._0_8_ = local_d8._0_8_;
        auVar73._8_8_ = 0;
        auVar73._0_8_ = local_d8._8_8_;
        auVar139._8_8_ = 0;
        auVar139._0_8_ = uVar202;
        auVar74._8_8_ = 0;
        auVar74._0_8_ = local_d8._16_8_ * 2;
        auVar140._8_8_ = 0;
        auVar140._0_8_ = local_d8._24_8_;
        auVar4 = auVar73 * auVar139 + auVar170 + auVar74 * auVar140;
        uVar213 = auVar4._0_8_;
        auVar172._8_8_ = 0;
        auVar172._0_8_ = uVar213 >> 0x34 | auVar4._8_8_ << 0xc;
        auVar141._8_8_ = 0;
        auVar141._0_8_ = (uVar213 & 0xfffffffffffff) << 4 | local_148;
        auVar4 = auVar72 * auVar138 + ZEXT816(0x1000003d1) * auVar141;
        uVar213 = auVar4._0_8_;
        local_178.n[0] = uVar213 & 0xfffffffffffff;
        auVar171._8_8_ = 0;
        auVar171._0_8_ = uVar213 >> 0x34 | auVar4._8_8_ << 0xc;
        auVar75._8_8_ = 0;
        auVar75._0_8_ = local_d8._0_8_ * 2;
        auVar142._8_8_ = 0;
        auVar142._0_8_ = local_d8._8_8_;
        auVar76._8_8_ = 0;
        auVar76._0_8_ = local_d8._16_8_;
        auVar143._8_8_ = 0;
        auVar143._0_8_ = uVar202;
        auVar77._8_8_ = 0;
        auVar77._0_8_ = local_d8._24_8_;
        auVar144._8_8_ = 0;
        auVar144._0_8_ = local_d8._24_8_;
        auVar5 = auVar76 * auVar143 + auVar172 + auVar77 * auVar144;
        uVar213 = auVar5._0_8_;
        auVar78._8_8_ = 0;
        auVar78._0_8_ = uVar213 & 0xfffffffffffff;
        auVar4 = auVar75 * auVar142 + auVar171 + auVar78 * ZEXT816(0x1000003d10);
        uVar201 = auVar4._0_8_;
        auVar174._8_8_ = 0;
        auVar174._0_8_ = uVar213 >> 0x34 | auVar5._8_8_ << 0xc;
        local_178.n[1] = uVar201 & 0xfffffffffffff;
        auVar173._8_8_ = 0;
        auVar173._0_8_ = uVar201 >> 0x34 | auVar4._8_8_ << 0xc;
        auVar79._8_8_ = 0;
        auVar79._0_8_ = local_d8._0_8_ * 2;
        auVar145._8_8_ = 0;
        auVar145._0_8_ = local_d8._16_8_;
        auVar80._8_8_ = 0;
        auVar80._0_8_ = local_d8._8_8_;
        auVar146._8_8_ = 0;
        auVar146._0_8_ = local_d8._8_8_;
        auVar81._8_8_ = 0;
        auVar81._0_8_ = local_d8._24_8_;
        auVar147._8_8_ = 0;
        auVar147._0_8_ = uVar202;
        auVar174 = auVar81 * auVar147 + auVar174;
        uVar202 = auVar174._0_8_;
        auVar82._8_8_ = 0;
        auVar82._0_8_ = uVar202 & 0xfffffffffffff;
        auVar4 = auVar79 * auVar145 + auVar173 + auVar80 * auVar146 +
                 auVar82 * ZEXT816(0x1000003d10);
        uVar213 = auVar4._0_8_;
        local_178.n[2] = uVar213 & 0xfffffffffffff;
        auVar175._8_8_ = 0;
        auVar175._0_8_ = (uVar213 >> 0x34 | auVar4._8_8_ << 0xc) + local_1c0;
        auVar83._8_8_ = 0;
        auVar83._0_8_ = uVar202 >> 0x34 | auVar174._8_8_ << 0xc;
        auVar175 = auVar83 * ZEXT816(0x1000003d10) + auVar175;
        uVar202 = auVar175._0_8_;
        local_178.n[3] = uVar202 & 0xfffffffffffff;
        local_178.n[4] = (uVar202 >> 0x34 | auVar175._8_8_ << 0xc) + local_140;
        local_178.magnitude = 1;
        local_178.normalized = 0;
        psStack_1e0 = (secp256k1_gej *)0x115900;
        secp256k1_fe_verify(&local_178);
        psStack_1e0 = (secp256k1_gej *)0x115910;
        secp256k1_fe_mul(&local_178,&local_178,(secp256k1_fe *)local_1a8);
        if (local_1d0 != (secp256k1_fe *)0x0) {
          psStack_1e0 = (secp256k1_gej *)0x115927;
          secp256k1_fe_mul(&local_178,&local_178,local_1d0);
        }
        psStack_1e0 = (secp256k1_gej *)0x115937;
        secp256k1_fe_inv(&local_178,&local_178);
        psStack_1e0 = (secp256k1_gej *)0x11594c;
        secp256k1_fe_mul(local_1b8,(secp256k1_fe *)local_138,&local_178);
        return 1;
      }
      goto LAB_0011597b;
    }
    psStack_1e0 = (secp256k1_gej *)0x114fc5;
    secp256k1_fe_verify(d);
    uVar202 = (d->n[4] >> 0x30) * 0x1000003d1 + d->n[0];
    uVar213 = (uVar202 >> 0x34) + d->n[1];
    psStack_1c98 = (secp256k1_gej *)((uVar213 >> 0x34) + d->n[2]);
    psVar208 = (secp256k1_gej *)(((ulong)psStack_1c98 >> 0x34) + d->n[3]);
    uVar201 = ((ulong)psVar208 >> 0x34) + (d->n[4] & 0xffffffffffff);
    if ((((uVar213 | uVar202 | (ulong)psStack_1c98 | (ulong)psVar208) & 0xfffffffffffff) == 0 &&
         uVar201 == 0) ||
       (((uVar202 ^ 0x1000003d0) & uVar213 & (ulong)psStack_1c98 & (ulong)psVar208 &
        (uVar201 ^ 0xf000000000000)) == 0xfffffffffffff)) goto LAB_00115980;
    psStack_1e0 = (secp256k1_gej *)0x115069;
    psVar209 = d;
    secp256k1_fe_verify(d);
    uVar181 = (uint)psVar209;
    if (8 < d->magnitude) goto LAB_00115985;
    psVar188 = (secp256k1_gej *)local_138;
    uVar202 = d->n[0];
    uVar213 = d->n[1];
    psVar214 = (secp256k1_fe *)d->n[2];
    unaff_R13 = d->n[3];
    uVar201 = d->n[4];
    n = (secp256k1_fe *)0xfffffffffffff;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar202 * 2;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = unaff_R13;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar213 * 2;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = psVar214;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar201;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uVar201;
    uVar184 = SUB168(auVar26 * auVar102,0);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar184 & 0xfffffffffffff;
    auVar4 = auVar25 * auVar101 + auVar24 * auVar100 + auVar27 * ZEXT816(0x1000003d10);
    uVar200 = auVar4._0_8_;
    local_d8._64_8_ = uVar200 & 0xfffffffffffff;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = uVar200 >> 0x34 | auVar4._8_8_ << 0xc;
    psVar196 = (secp256k1_fe *)(uVar201 * 2);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar202;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = psVar196;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar213 * 2;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = unaff_R13;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = psVar214;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = psVar214;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar184 >> 0x34 | SUB168(auVar26 * auVar102,8) << 0xc;
    auVar4 = auVar28 * auVar103 + auVar155 + auVar29 * auVar104 + auVar30 * auVar105 +
             auVar31 * ZEXT816(0x1000003d10);
    uVar201 = auVar4._0_8_;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uVar201 >> 0x34 | auVar4._8_8_ << 0xc;
    local_1c0 = (uVar201 & 0xfffffffffffff) >> 0x30;
    psStack_1c98 = (secp256k1_gej *)(uVar201 & 0xffffffffffff);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar202;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uVar202;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar213;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = psVar196;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = (long)psVar214 * 2;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = unaff_R13;
    auVar4 = auVar33 * auVar107 + auVar156 + auVar34 * auVar108;
    uVar201 = auVar4._0_8_;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uVar201 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = (uVar201 & 0xfffffffffffff) << 4 | local_1c0;
    auVar4 = auVar32 * auVar106 + ZEXT816(0x1000003d1) * auVar109;
    uVar201 = auVar4._0_8_;
    local_138._0_8_ = uVar201 & 0xfffffffffffff;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar201 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar202 * 2;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar213;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = psVar214;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = psVar196;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = unaff_R13;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = unaff_R13;
    auVar5 = auVar36 * auVar111 + auVar158 + auVar37 * auVar112;
    uVar201 = auVar5._0_8_;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar201 & 0xfffffffffffff;
    auVar4 = auVar35 * auVar110 + auVar157 + auVar38 * ZEXT816(0x1000003d10);
    uVar184 = auVar4._0_8_;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uVar201 >> 0x34 | auVar5._8_8_ << 0xc;
    local_138._8_8_ = uVar184 & 0xfffffffffffff;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = uVar184 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar202 * 2;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = psVar214;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar213;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uVar213;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = unaff_R13;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = psVar196;
    auVar160 = auVar41 * auVar115 + auVar160;
    uVar202 = auVar160._0_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar202 & 0xfffffffffffff;
    auVar4 = auVar39 * auVar113 + auVar159 + auVar40 * auVar114 + auVar42 * ZEXT816(0x1000003d10);
    uVar213 = auVar4._0_8_;
    d = (secp256k1_fe *)(uVar202 >> 0x34 | auVar160._8_8_ << 0xc);
    auVar161._8_8_ = 0;
    auVar161._0_8_ = (uVar213 >> 0x34 | auVar4._8_8_ << 0xc) + local_d8._64_8_;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = d;
    auVar161 = auVar43 * ZEXT816(0x1000003d10) + auVar161;
    uVar202 = auVar161._0_8_;
    uStack_120 = uVar202 & 0xfffffffffffff;
    local_138._16_8_ = uVar213 & 0xfffffffffffff;
    local_118 = (long)(psStack_1c98->x).n + (uVar202 >> 0x34 | auVar161._8_8_ << 0xc);
    local_110 = 1;
    psStack_1e0 = (secp256k1_gej *)0x1152b9;
    local_178.n[0] = (uint64_t)psStack_1c98;
    secp256k1_fe_verify((secp256k1_fe *)psVar188);
    psStack_1e0 = (secp256k1_gej *)0x1152c1;
    psVar208 = psVar188;
    secp256k1_fe_verify((secp256k1_fe *)psVar188);
    uVar181 = (uint)psVar208;
    if (0x10 < (int)local_110) goto LAB_0011598a;
    d = (secp256k1_fe *)local_138;
    local_138._0_8_ = local_138._0_8_ * 2;
    local_138._8_8_ = local_138._8_8_ * 2;
    uStack_120 = uStack_120 * 2;
    local_138._16_8_ = local_138._16_8_ * 2;
    local_118 = local_118 << 1;
    local_110 = (ulong)(uint)((int)local_110 * 2);
    psStack_1e0 = (secp256k1_gej *)0x115307;
    secp256k1_fe_verify(d);
    psVar196 = local_1d0;
    psStack_1e0 = (secp256k1_gej *)0x11531a;
    psStack_1c98 = (secp256k1_gej *)d;
    secp256k1_fe_mul(d,d,local_1d0);
    psStack_1e0 = (secp256k1_gej *)0x115327;
    secp256k1_fe_verify((secp256k1_fe *)local_1a8);
    psStack_1e0 = (secp256k1_gej *)0x11532f;
    psVar208 = (secp256k1_gej *)d;
    secp256k1_fe_verify(d);
    n = local_1c8;
    uVar181 = (uint)psVar208;
    if ((int)local_110 + (int)local_180 < 0x21) {
      local_1a8._0_8_ = local_1a8._0_8_ + local_138._0_8_;
      local_1a8._8_8_ = local_1a8._8_8_ + local_138._8_8_;
      local_1a8._16_8_ = local_1a8._16_8_ + local_138._16_8_;
      uStack_190 = uStack_190 + uStack_120;
      local_188 = local_188 + local_118;
      local_180 = (ulong)(uint)((int)local_110 + (int)local_180);
      psStack_1e0 = (secp256k1_gej *)0x11538b;
      secp256k1_fe_verify((secp256k1_fe *)local_1a8);
      q = (secp256k1_scalar *)n;
      if (local_1d4 == 0) {
        psVar209 = (secp256k1_fe *)(local_d8 + 0x40);
        psStack_1e0 = (secp256k1_gej *)0x1153aa;
        secp256k1_fe_mul(psVar209,(secp256k1_fe *)local_1a8,psVar196);
        goto LAB_001153de;
      }
      goto LAB_001153eb;
    }
  }
  else {
    psStack_1e0 = (secp256k1_gej *)0x11596c;
    secp256k1_ecmult_const_xonly_cold_9();
    psVar196 = d;
LAB_0011596c:
    psStack_1e0 = (secp256k1_gej *)0x115971;
    secp256k1_ecmult_const_xonly_cold_8();
LAB_00115971:
    psStack_1e0 = (secp256k1_gej *)0x115976;
    secp256k1_ecmult_const_xonly_cold_7();
LAB_00115976:
    psStack_1e0 = (secp256k1_gej *)0x11597b;
    secp256k1_ecmult_const_xonly_cold_5();
LAB_0011597b:
    psStack_1e0 = (secp256k1_gej *)0x115980;
    secp256k1_ecmult_const_xonly_cold_6();
    d = r;
    psVar214 = n;
    n = (secp256k1_fe *)q;
LAB_00115980:
    uVar181 = (uint)psVar208;
    psStack_1e0 = (secp256k1_gej *)0x115985;
    secp256k1_ecmult_const_xonly_cold_1();
LAB_00115985:
    psStack_1e0 = (secp256k1_gej *)0x11598a;
    secp256k1_ecmult_const_xonly_cold_4();
LAB_0011598a:
    psStack_1e0 = (secp256k1_gej *)0x11598f;
    secp256k1_ecmult_const_xonly_cold_3();
  }
  psStack_1e0 = (secp256k1_gej *)main;
  secp256k1_ecmult_const_xonly_cold_2();
  psStack_208 = (secp256k1_gej *)d;
  psStack_200 = psVar214;
  uStack_1f8 = unaff_R13;
  psStack_1f0 = psVar196;
  psStack_1e8 = n;
  psStack_1e0 = psVar188;
  setbuf(_stdout,(char *)0x0);
  setbuf(_stderr,(char *)0x0);
  printf("Exhaustive tests for order %lu\n");
  if (1 < (int)uVar181) {
    lVar185 = strtol((char *)(psStack_1c98->x).n[1],(char **)0x0,0);
    count = (int)lVar185;
  }
  pcVar218 = (char *)0x0;
  printf("test count = %i\n",(ulong)(uint)count);
  if (2 < (int)uVar181) {
    pcVar218 = (char *)(psStack_1c98->x).n[2];
  }
  asStack_1390[0].ecmult_gen_ctx.built = 0;
  asStack_1390[0].ecmult_gen_ctx.blind = 0;
  asStack_1390[0].ecmult_gen_ctx.initial.x.n[0] = 0;
  uStack_1cd0 = (ulong)uVar181;
  if ((pcVar218 == (char *)0x0) || (*pcVar218 == '\0')) {
    __stream = fopen("/dev/urandom","rb");
    if (__stream == (FILE *)0x0) goto LAB_00117ed4;
    sVar186 = fread(asStack_1390,1,0x10,__stream);
    if (sVar186 != 0x10) goto LAB_00117ed4;
    goto LAB_00115add;
  }
  iVar179 = 0;
  while ((((iVar179 < 0x10 && (*pcVar218 != '\0')) && (pcVar218[1] != '\0')) &&
         (iVar180 = __isoc99_sscanf(pcVar218,"%2hx",auStack_9c0), iVar180 == 1))) {
    *(undefined1 *)((long)asStack_1390 + (long)iVar179) = auStack_9c0[0];
    pcVar218 = pcVar218 + 2;
    iVar179 = iVar179 + 1;
  }
  while( true ) {
    lVar185 = 0;
    printf("random seed = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
           asStack_1390[0].ecmult_gen_ctx._0_8_ & 0xff,
           (ulong)asStack_1390[0].ecmult_gen_ctx._0_8_ >> 8 & 0xff);
    auStack_9c0._0_8_ = 0xbb67ae856a09e667;
    auStack_9c0._8_8_ = 0xa54ff53a3c6ef372;
    auStack_9c0._16_8_ = 0x9b05688c510e527f;
    auStack_9c0._24_8_ = 0x5be0cd191f83d9ab;
    auStack_9c0._96_8_ = 0;
    secp256k1_sha256_write((secp256k1_sha256 *)auStack_9c0,(uchar *)"secp256k1 test init",0x13);
    secp256k1_sha256_write((secp256k1_sha256 *)auStack_9c0,(uchar *)asStack_1390,0x10);
    puVar219 = auStack_f10;
    secp256k1_sha256_finalize((secp256k1_sha256 *)auStack_9c0,puVar219);
    do {
      lVar195 = 0;
      uVar202 = 0;
      do {
        uVar202 = (ulong)puVar219[lVar195] | uVar202 << 8;
        lVar195 = lVar195 + 1;
      } while (lVar195 != 8);
      secp256k1_test_state[lVar185] = uVar202;
      lVar185 = lVar185 + 1;
      puVar219 = puVar219 + 8;
    } while (lVar185 != 4);
    if (4 < (int)uStack_1cd0) {
      lVar185 = strtol((char *)(psStack_1c98->x).n[3],(char **)0x0,0);
      num_cores = (uint32_t)lVar185;
      uVar202 = strtol((char *)(psStack_1c98->x).n[4],(char **)0x0,0);
      this_core = (uint32_t)uVar202;
      if (((ulong)num_cores == 0) || (num_cores <= this_core)) {
        main_cold_2();
        return 1;
      }
      printf("running tests for core %lu (out of [0..%lu])\n",uVar202 & 0xffffffff,
             (ulong)num_cores - 1);
    }
    psVar210 = (secp256k1_context *)0x1a000;
    psVar187 = (secp256k1_ge *)malloc(0x1a000);
    if (psVar187 == (secp256k1_ge *)0x0) break;
    secp256k1_gej_set_ge((secp256k1_gej *)auStack_9c0,&secp256k1_ge_const_g);
    a_00 = (secp256k1_context *)auStack_1990;
    secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)a_00,(uchar *)"The scalar for this x is unknown");
    bVar176 = (auStack_1980._0_8_ & auStack_1980._8_8_ & auStack_1990._8_8_) == 0xfffffffffffff;
    bVar177 = uStack_1970 == 0xffffffffffff;
    bVar226 = 0xffffefffffc2e < (ulong)auStack_1990._0_8_;
    if (bVar226 && (bVar176 && bVar177)) {
      uStack_1968 = CONCAT44(uStack_1968._4_4_,0xffffffff);
    }
    else {
      a_00 = (secp256k1_context *)auStack_1990;
      uStack_1968 = 0x100000001;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
    }
    if (bVar226 && (bVar176 && bVar177)) goto LAB_00117f43;
    a_00 = asStack_1390;
    iVar179 = secp256k1_ge_set_xo_var((secp256k1_ge *)a_00,(secp256k1_fe *)auStack_1990,0);
    if (iVar179 == 0) goto LAB_00117f48;
    secp256k1_gej_set_ge((secp256k1_gej *)auStack_f10,(secp256k1_ge *)asStack_1390);
    psVar196 = (secp256k1_fe *)0x0;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)auStack_f10,(secp256k1_gej *)auStack_f10,&secp256k1_ge_const_g,
               (secp256k1_fe *)0x0);
    psVar210 = (secp256k1_context *)0x26000;
    psVar188 = (secp256k1_gej *)malloc(0x26000);
    if (psVar188 == (secp256k1_gej *)0x0) goto LAB_00117f7a;
    memcpy(asStack_1390,auStack_9c0,0x98);
    memcpy(auStack_1990,auStack_f10,0x98);
    lVar185 = 0;
    psVar208 = psVar188;
    do {
      memcpy(psVar188 + lVar185 * 0x10,auStack_1990,0x98);
      lVar195 = 0xf;
      a = psVar208;
      do {
        secp256k1_gej_add_var(a + 1,a,(secp256k1_gej *)asStack_1390,psVar196);
        lVar195 = lVar195 + -1;
        a = a + 1;
      } while (lVar195 != 0);
      iVar179 = 4;
      do {
        secp256k1_gej_double_var
                  ((secp256k1_gej *)asStack_1390,(secp256k1_gej *)asStack_1390,(secp256k1_fe *)0x0);
        iVar179 = iVar179 + -1;
      } while (iVar179 != 0);
      secp256k1_gej_double_var
                ((secp256k1_gej *)auStack_1990,(secp256k1_gej *)auStack_1990,(secp256k1_fe *)0x0);
      if (lVar185 == 0x3e) {
        secp256k1_gej_neg((secp256k1_gej *)auStack_1990,(secp256k1_gej *)auStack_1990);
        secp256k1_gej_add_var
                  ((secp256k1_gej *)auStack_1990,(secp256k1_gej *)auStack_1990,
                   (secp256k1_gej *)auStack_f10,psVar196);
      }
      lVar185 = lVar185 + 1;
      psVar208 = psVar208 + 0x10;
    } while (lVar185 != 0x40);
    lVar185 = -1;
    lVar215 = 0;
    lVar195 = 0;
    psVar217 = psVar187;
    do {
      secp256k1_gej_verify((secp256k1_gej *)((long)(psVar188->x).n + lVar215));
      if (*(int *)((long)(&psVar188->z + 1) + lVar215) == 0) {
        if (lVar185 == -1) {
          puVar203 = (uint64_t *)((long)(psVar188->z).n + lVar215);
          uVar205 = *puVar203;
          uVar178 = puVar203[1];
          auVar4 = *(undefined1 (*) [16])((long)(psVar188->z).n + lVar215 + 0x10);
          puVar1 = (undefined4 *)((long)(psVar188->z).n + lVar215 + 0x20);
          uVar216 = puVar1[1];
          iVar179 = puVar1[2];
          iVar180 = puVar1[3];
          *(undefined4 *)((psVar217->x).n + 4) = *puVar1;
          *(undefined4 *)((long)(psVar217->x).n + 0x24) = uVar216;
          (psVar217->x).magnitude = iVar179;
          (psVar217->x).normalized = iVar180;
          *(undefined1 (*) [16])((psVar217->x).n + 2) = auVar4;
          (psVar217->x).n[0] = uVar205;
          (psVar217->x).n[1] = uVar178;
          lVar185 = lVar195;
        }
        else {
          secp256k1_fe_mul(&psVar217->x,&psVar187[lVar185].x,
                           (secp256k1_fe *)((long)(psVar188->z).n + lVar215));
          lVar185 = lVar195;
        }
      }
      else {
        secp256k1_ge_set_infinity(psVar217);
      }
      lVar195 = lVar195 + 1;
      psVar217 = psVar217 + 1;
      lVar215 = lVar215 + 0x98;
    } while (lVar195 != 0x400);
    if (lVar185 != -1) {
      a_00 = (secp256k1_context *)auStack_1690;
      secp256k1_fe_inv_var((secp256k1_fe *)a_00,&psVar187[lVar185].x);
      if (lVar185 != 0) {
        psVar217 = psVar187 + lVar185;
        piVar198 = &psVar188[lVar185 + -1].infinity;
        lVar195 = lVar185;
        do {
          lVar195 = lVar195 + -1;
          psVar217 = psVar217 + -1;
          if (*piVar198 == 0) {
            a_00 = (secp256k1_context *)auStack_1690;
            secp256k1_fe_mul(&psVar187[lVar185].x,&psVar217->x,(secp256k1_fe *)a_00);
            secp256k1_fe_mul((secp256k1_fe *)a_00,(secp256k1_fe *)a_00,&psVar188[lVar185].z);
            lVar185 = lVar195;
          }
          piVar198 = piVar198 + -0x26;
        } while (lVar195 != 0);
      }
      if (psVar188[lVar185].infinity != 0) goto LAB_00117f4d;
      psVar196 = &psVar187[lVar185].x;
      *(undefined4 *)(psVar196->n + 4) = auStack_1670._0_4_;
      *(undefined4 *)((long)psVar196->n + 0x24) = auStack_1670._4_4_;
      *(undefined4 *)(psVar196->n + 4 + 1) = auStack_1670._8_4_;
      psVar196->normalized = auStack_1670._12_4_;
      *(undefined1 (*) [16])(psVar187[lVar185].x.n + 2) = auStack_1680;
      psVar187[lVar185].x.n[0] = auStack_1690._0_8_;
      psVar187[lVar185].x.n[1] = auStack_1690._8_8_;
      lVar185 = 0;
      psVar208 = psVar188;
      do {
        if (psVar208->infinity == 0) {
          psVar217 = (secp256k1_ge *)((long)(psVar187->x).n + lVar185);
          secp256k1_ge_set_gej_zinv(psVar217,psVar208,(secp256k1_fe *)psVar217);
        }
        secp256k1_ge_verify((secp256k1_ge *)((long)(psVar187->x).n + lVar185));
        lVar185 = lVar185 + 0x68;
        psVar208 = psVar208 + 1;
      } while (lVar185 != 0x1a000);
    }
    free(psVar188);
    pasVar224 = secp256k1_ecmult_gen_prec_table;
    lVar185 = 0;
    psVar217 = psVar187;
    do {
      lVar195 = 0;
      a_01 = psVar217;
      do {
        secp256k1_ge_to_storage((secp256k1_ge_storage *)((long)(*pasVar224)[0].x.n + lVar195),a_01);
        lVar195 = lVar195 + 0x40;
        a_01 = a_01 + 1;
      } while (lVar195 != 0x400);
      lVar185 = lVar185 + 1;
      psVar217 = psVar217 + 0x10;
      pasVar224 = pasVar224 + 1;
    } while (lVar185 != 0x40);
    free(psVar187);
    secp256k1_gej_set_ge((secp256k1_gej *)auStack_9c0,&secp256k1_ge_const_g);
    secp256k1_ecmult_compute_table(secp256k1_pre_g,(int)(secp256k1_gej *)auStack_9c0,gen);
    iVar179 = 0x80;
    do {
      secp256k1_gej_double_var
                ((secp256k1_gej *)auStack_9c0,(secp256k1_gej *)auStack_9c0,(secp256k1_fe *)0x0);
      iVar179 = iVar179 + -1;
    } while (iVar179 != 0);
    secp256k1_ecmult_compute_table(secp256k1_pre_g_128,(int)auStack_9c0,gen_00);
    iVar179 = count;
joined_r0x001160d6:
    count = iVar179 + -1;
    if (iVar179 == 0) {
      secp256k1_testrand256((uchar *)asStack_1390);
      printf("random run = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
             asStack_1390[0].ecmult_gen_ctx._0_8_ & 0xff,
             (ulong)asStack_1390[0].ecmult_gen_ctx._0_8_ >> 8 & 0xff,
             (ulong)asStack_1390[0].ecmult_gen_ctx._0_8_ >> 0x10 & 0xff,
             (ulong)asStack_1390[0].ecmult_gen_ctx._0_8_ >> 0x18 & 0xff,
             (ulong)asStack_1390[0].ecmult_gen_ctx._0_8_ >> 0x20 & 0xff,
             (ulong)asStack_1390[0].ecmult_gen_ctx._0_8_ >> 0x28 & 0xff,
             (ulong)asStack_1390[0].ecmult_gen_ctx._0_8_ >> 0x30 & 0xff,
             (ulong)asStack_1390[0].ecmult_gen_ctx._0_8_ >> 0x38,
             asStack_1390[0].ecmult_gen_ctx.initial.x.n[0] & 0xff,
             asStack_1390[0].ecmult_gen_ctx.initial.x.n[0] >> 8 & 0xff,
             asStack_1390[0].ecmult_gen_ctx.initial.x.n[0] >> 0x10 & 0xff,
             asStack_1390[0].ecmult_gen_ctx.initial.x.n[0] >> 0x18 & 0xff,
             asStack_1390[0].ecmult_gen_ctx.initial.x.n[0] >> 0x20 & 0xff,
             asStack_1390[0].ecmult_gen_ctx.initial.x.n[0] >> 0x28 & 0xff,
             asStack_1390[0].ecmult_gen_ctx.initial.x.n[0] >> 0x30 & 0xff,
             asStack_1390[0].ecmult_gen_ctx.initial.x.n[0] >> 0x38);
      puts("no problems found");
      return 0;
    }
    ctx = secp256k1_context_create(1);
    secp256k1_testrand256(auStack_19b0);
    a_00 = ctx;
    iVar179 = secp256k1_context_randomize(ctx,auStack_19b0);
    if (iVar179 == 0) goto LAB_00117f52;
    secp256k1_gej_set_infinity((secp256k1_gej *)auStack_9c0);
    secp256k1_ge_set_gej((secp256k1_ge *)auStack_f10,(secp256k1_gej *)auStack_9c0);
    lVar185 = -0x4e0;
    iVar179 = 1;
    psVar188 = (secp256k1_gej *)auStack_9c0;
    do {
      psVar208 = psVar188 + 1;
      secp256k1_gej_add_ge(psVar208,psVar188,&secp256k1_ge_const_g);
      secp256k1_ge_set_gej((secp256k1_ge *)(auStack_9c8 + lVar185),psVar208);
      if (count != 0) {
        random_fe((secp256k1_fe *)asStack_1390);
        secp256k1_gej_rescale(psVar208,(secp256k1_fe *)asStack_1390);
      }
      auStack_1690._0_4_ = iVar179;
      secp256k1_ecmult_gen
                (&ctx->ecmult_gen_ctx,(secp256k1_gej *)asStack_1390,(secp256k1_scalar *)auStack_1690
                );
      a_00 = (secp256k1_context *)auStack_1990;
      secp256k1_ge_set_gej((secp256k1_ge *)a_00,(secp256k1_gej *)asStack_1390);
      if (*(int *)(auStack_9c0 + lVar185 + 0x58) != 0) goto LAB_00117f1b;
      if (iStack_1930 != 0) goto LAB_00117f20;
      a_00 = (secp256k1_context *)auStack_1990;
      iVar180 = secp256k1_fe_equal_var((secp256k1_fe *)a_00,(secp256k1_fe *)(auStack_9c8 + lVar185))
      ;
      if (iVar180 == 0) goto LAB_00117f25;
      a_00 = (secp256k1_context *)auStack_1960;
      iVar180 = secp256k1_fe_equal_var
                          ((secp256k1_fe *)a_00,(secp256k1_fe *)(auStack_9c0 + lVar185 + 0x28));
      if (iVar180 == 0) goto LAB_00117f2a;
      iVar179 = iVar179 + 1;
      lVar185 = lVar185 + 0x68;
      psVar188 = psVar208;
    } while (lVar185 != 0);
    uVar202 = 0;
    puVar225 = auStack_f10;
    lVar185 = 0;
    do {
      secp256k1_ge_mul_lambda((secp256k1_ge *)asStack_1390,(secp256k1_ge *)(auStack_f10 + lVar185));
      ge_equals_ge((secp256k1_ge *)(puVar225 + (uVar202 / 0xd) * -0x548),
                   (secp256k1_ge *)asStack_1390);
      lVar185 = lVar185 + 0x68;
      puVar225 = puVar225 + 0x3a8;
      uVar202 = uVar202 + 9;
    } while (lVar185 != 0x548);
    a_00 = (secp256k1_context *)auStack_f10;
    secp256k1_ge_verify((secp256k1_ge *)a_00);
    if (auStack_f10._96_4_ == 0) goto LAB_00117f57;
    a_00 = (secp256k1_context *)auStack_9c0;
    secp256k1_gej_verify((secp256k1_gej *)a_00);
    if (auStack_9c0._144_4_ == 0) goto LAB_00117f5c;
    lVar185 = 0xc;
    psVar210 = (secp256k1_context *)(auStack_f10 + 0x68);
    a_02 = (secp256k1_context *)(auStack_9c0 + 0x98);
    do {
      a_00 = psVar210;
      secp256k1_ge_verify((secp256k1_ge *)psVar210);
      if ((psVar210->ecmult_gen_ctx).initial.y.magnitude != 0) goto LAB_00117f2f;
      a_00 = a_02;
      secp256k1_gej_verify((secp256k1_gej *)a_02);
      if ((a_02->ecmult_gen_ctx).initial.z.magnitude != 0) goto LAB_00117f34;
      a_02 = (secp256k1_context *)&(a_02->ecmult_gen_ctx).initial.infinity;
      psVar210 = (secp256k1_context *)&(psVar210->ecmult_gen_ctx).initial.z;
      lVar185 = lVar185 + -1;
    } while (lVar185 != 0);
    puStack_1cc8 = auStack_f10;
    uStack_1cc0 = 0;
    uStack_1cb0 = 0;
    do {
      bVar226 = true;
      if ((ulong)num_cores != 1) {
        uStack_1cb0 = uStack_1cb0 + 0xe7037ed1a0b428db;
        bVar226 = (uint32_t)
                  ((uStack_1cb0 >> 0x20 ^ uStack_1cb0 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                  this_core;
      }
      if (bVar226) {
        lVar185 = uStack_1cc0 * 0x98;
        secp256k1_fe_inv((secp256k1_fe *)auStack_1690,(secp256k1_fe *)(auStack_9c0 + lVar185 + 0x60)
                        );
        lVar195 = 0;
        uVar202 = uStack_1cc0;
        puVar225 = puStack_1cc8;
        do {
          psVar187 = (secp256k1_ge *)(puVar225 + (uVar202 / 0xd) * -0x548);
          psVar188 = (secp256k1_gej *)(auStack_9c0 + lVar195);
          secp256k1_gej_add_var
                    ((secp256k1_gej *)asStack_1390,psVar188,(secp256k1_gej *)(auStack_9c0 + lVar185)
                     ,(secp256k1_fe *)0x4ec4ec4ec4ec4ec5);
          ge_equals_gej(psVar187,(secp256k1_gej *)asStack_1390);
          if (uStack_1cc0 != 0) {
            secp256k1_gej_add_ge
                      ((secp256k1_gej *)asStack_1390,psVar188,
                       (secp256k1_ge *)(auStack_f10 + uStack_1cc0 * 0x68));
            ge_equals_gej(psVar187,(secp256k1_gej *)asStack_1390);
          }
          secp256k1_gej_add_ge_var
                    ((secp256k1_gej *)asStack_1390,psVar188,
                     (secp256k1_ge *)(auStack_f10 + uStack_1cc0 * 0x68),(secp256k1_fe *)0x0);
          ge_equals_gej(psVar187,(secp256k1_gej *)asStack_1390);
          iStack_1930 = *(int *)(auStack_9c0 + lVar185 + 0x90);
          uStack_1970 = *(uint64_t *)(auStack_9c0 + lVar185 + 0x20);
          uStack_1968 = *(uint64_t *)(auStack_9c0 + lVar185 + 0x28);
          auStack_1980._8_8_ = *(undefined8 *)(auStack_9c0 + lVar185 + 0x18);
          auStack_1980._0_8_ = *(undefined8 *)(auStack_9c0 + lVar185 + 0x10);
          auStack_1990._8_8_ = *(undefined8 *)(auStack_9c0 + lVar185 + 8);
          auStack_1990._0_8_ = (((secp256k1_gej *)(auStack_9c0 + lVar185))->x).n[0];
          auStack_1960._0_8_ = *(undefined8 *)(auStack_9c0 + lVar185 + 0x30);
          auStack_1960._8_8_ = *(undefined8 *)(auStack_9c0 + lVar185 + 0x38);
          auStack_1960._16_16_ = *(undefined1 (*) [16])(auStack_9c0 + lVar185 + 0x40);
          uStack_1940 = *(undefined4 *)(auStack_9c0 + lVar185 + 0x50);
          uStack_193c = *(undefined4 *)(auStack_9c0 + lVar185 + 0x54);
          iStack_1938 = *(int *)(auStack_9c0 + lVar185 + 0x58);
          iStack_1934 = *(int *)(auStack_9c0 + lVar185 + 0x5c);
          secp256k1_gej_add_zinv_var
                    ((secp256k1_gej *)asStack_1390,psVar188,(secp256k1_ge *)auStack_1990,
                     (secp256k1_fe *)auStack_1690);
          ge_equals_gej(psVar187,(secp256k1_gej *)asStack_1390);
          lVar195 = lVar195 + 0x98;
          puVar225 = puVar225 + 0x68;
          uVar202 = uVar202 + 1;
        } while (lVar195 != 0x7b8);
      }
      uStack_1cc0 = uStack_1cc0 + 1;
      puStack_1cc8 = puStack_1cc8 + 0x68;
    } while (uStack_1cc0 != 0xd);
    uVar202 = 0;
    puVar225 = auStack_f10;
    lVar185 = 0;
    do {
      secp256k1_gej_double((secp256k1_gej *)asStack_1390,(secp256k1_gej *)(auStack_9c0 + lVar185));
      ge_equals_gej((secp256k1_ge *)(puVar225 + (uVar202 / 0xd) * -0x548),
                    (secp256k1_gej *)asStack_1390);
      secp256k1_gej_double_var
                ((secp256k1_gej *)asStack_1390,(secp256k1_gej *)(auStack_9c0 + lVar185),
                 (secp256k1_fe *)0x0);
      ge_equals_gej((secp256k1_ge *)(puVar225 + (uVar202 / 0xd) * -0x548),
                    (secp256k1_gej *)asStack_1390);
      lVar185 = lVar185 + 0x98;
      puVar225 = puVar225 + 0xd0;
      uVar202 = uVar202 + 2;
    } while (lVar185 != 0x7b8);
    lVar185 = 0x68;
    psVar187 = &sStack_a30;
    psVar188 = (secp256k1_gej *)(auStack_9c0 + 0x98);
    do {
      secp256k1_ge_neg((secp256k1_ge *)auStack_1990,(secp256k1_ge *)(auStack_f10 + lVar185));
      ge_equals_ge(psVar187,(secp256k1_ge *)auStack_1990);
      secp256k1_gej_neg((secp256k1_gej *)asStack_1390,psVar188);
      ge_equals_gej(psVar187,(secp256k1_gej *)asStack_1390);
      lVar185 = lVar185 + 0x68;
      psVar188 = psVar188 + 1;
      psVar187 = psVar187 + -1;
    } while (lVar185 != 0x548);
    lVar185 = 1;
    lVar195 = 0x68;
    uStack_1cb0 = 0;
    do {
      uVar202 = 0;
      puStack_1cc8 = auStack_f10;
      do {
        bVar226 = true;
        if ((ulong)num_cores != 1) {
          uStack_1cb0 = uStack_1cb0 + 0xe7037ed1a0b428db;
          bVar226 = (uint32_t)
                    ((uStack_1cb0 >> 0x20 ^ uStack_1cb0 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                    this_core;
        }
        if (bVar226) {
          iVar179 = 0;
          puVar225 = puStack_1cc8;
          uVar213 = uVar202;
          do {
            auStack_1bf0._0_4_ = iVar179;
            auStack_1c20._0_4_ = (int)uVar202;
            auStack_1c70._8_8_ = auStack_1990;
            auStack_1c70._0_8_ = auStack_1690;
            auStack_1c60._0_8_ = asStack_1390;
            secp256k1_ecmult_strauss_wnaf
                      ((secp256k1_strauss_state *)auStack_1c70,(secp256k1_gej *)auStack_1b30,1,
                       (secp256k1_gej *)(auStack_9c0 + lVar185 * 0x98),
                       (secp256k1_scalar *)auStack_1bf0,(secp256k1_scalar *)auStack_1c20);
            ge_equals_gej((secp256k1_ge *)(puVar225 + (uVar213 / 0xd) * -0x548),
                          (secp256k1_gej *)auStack_1b30);
            iVar179 = iVar179 + 1;
            puVar225 = puVar225 + lVar195;
            uVar213 = uVar213 + lVar185;
          } while (iVar179 != 0xd);
        }
        n_points = (ulong *)auStack_1bf0;
        uVar202 = uVar202 + 1;
        puStack_1cc8 = puStack_1cc8 + 0x68;
      } while ((int)uVar202 != 0xd);
      lVar185 = lVar185 + 1;
      lVar195 = lVar195 + 0x68;
    } while (lVar185 != 0xd);
    uStack_1cd0 = 0;
LAB_00116849:
    lVar185 = 0;
LAB_00116850:
    bVar226 = true;
    if ((ulong)num_cores != 1) {
      uStack_1cb0 = uStack_1cb0 + 0xe7037ed1a0b428db;
      bVar226 = (uint32_t)
                ((uStack_1cb0 >> 0x20 ^ uStack_1cb0 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                this_core;
    }
    if (!bVar226) goto LAB_00116a13;
    auStack_1c70._0_4_ = (int)uStack_1cd0;
    psVar187 = (secp256k1_ge *)(auStack_f10 + lVar185 * 0x68);
    secp256k1_ecmult_const((secp256k1_gej *)asStack_1390,psVar187,(secp256k1_scalar *)auStack_1c70);
    uVar181 = (int)lVar185 * (int)uStack_1cd0;
    __stream = (FILE *)(auStack_f10 +
                       (ulong)(uVar181 - (uVar181 / 0xd + (uVar181 / 0xd) * 0xc)) * 0x68);
    ge_equals_gej((secp256k1_ge *)__stream,(secp256k1_gej *)asStack_1390);
    if (lVar185 == 0 || uStack_1cd0 == 0) goto LAB_00116a13;
    a_00 = (secp256k1_context *)auStack_1b30;
    psVar210 = a_00;
    iVar179 = secp256k1_ecmult_const_xonly
                        ((secp256k1_fe *)a_00,(secp256k1_fe *)psVar187,(secp256k1_fe *)0x0,
                         (secp256k1_scalar *)auStack_1c70,0);
    if (iVar179 == 0) goto LAB_00117f07;
    iVar179 = secp256k1_fe_equal_var((secp256k1_fe *)a_00,(secp256k1_fe *)__stream);
    psVar210 = a_00;
    if (iVar179 == 0) goto LAB_00117f0c;
    iVar179 = -0xb;
    while( true ) {
      iVar179 = iVar179 + 1;
      if (iVar179 == 0) goto LAB_00117f3e;
      a_00 = (secp256k1_context *)auStack_1690;
      random_fe((secp256k1_fe *)a_00);
      secp256k1_fe_normalize((secp256k1_fe *)a_00);
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      if (auStack_1670._12_4_ == 0) break;
      if ((SUB168(auStack_1680 | auStack_1690,8) != 0 || SUB168(auStack_1680 | auStack_1690,0) != 0)
          || auStack_1670._0_8_ != 0) goto code_r0x001169b1;
    }
    main_cold_40();
LAB_00117ed4:
    main_cold_1();
LAB_00115add:
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
  }
LAB_00117f75:
  main_cold_52();
LAB_00117f7a:
  main_cold_49();
LAB_00117f7f:
  main_cold_37();
LAB_00117f84:
  main_cold_36();
LAB_00117f89:
  main_cold_35();
LAB_00117f8e:
  main_cold_34();
LAB_00117f93:
  main_cold_33();
LAB_00117f98:
  main_cold_32();
LAB_00117f9d:
  main_cold_12();
LAB_00117fa2:
  main_cold_31();
LAB_00117fa7:
  main_cold_13();
LAB_00117fac:
  main_cold_30();
LAB_00117fb1:
  main_cold_14();
LAB_00117fb6:
  a_00 = psVar210;
  main_cold_29();
LAB_00117fbb:
  main_cold_28();
LAB_00117fc0:
  main_cold_15();
LAB_00117fc5:
  main_cold_18();
LAB_00117fca:
  main_cold_27();
LAB_00117fcf:
  main_cold_26();
LAB_00117fd4:
  main_cold_25();
LAB_00117fd9:
  main_cold_16();
LAB_00117fde:
  main_cold_17();
LAB_00117fe3:
  main_cold_22();
LAB_00117fe8:
  main_cold_23();
  lVar185 = 0;
  do {
    uVar205 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
              secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
    uVar201 = secp256k1_test_state[1] << 0x11;
    uVar213 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
    uVar202 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
    secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar213;
    secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar202;
    secp256k1_test_state[3] = uVar202 << 0x2d | uVar202 >> 0x13;
    secp256k1_test_state[2] = uVar213 ^ uVar201;
    (a_00->ecmult_gen_ctx).initial.x.n[lVar185 + -1] = uVar205;
    lVar185 = lVar185 + 1;
  } while ((int)lVar185 != 4);
  return (int)secp256k1_test_state[0];
code_r0x001169b1:
  secp256k1_fe_mul((secp256k1_fe *)auStack_1990,(secp256k1_fe *)auStack_1690,
                   (secp256k1_fe *)psVar187);
  a_00 = (secp256k1_context *)auStack_1b30;
  n_points = (ulong *)0x0;
  psVar210 = a_00;
  iVar179 = secp256k1_ecmult_const_xonly
                      ((secp256k1_fe *)a_00,(secp256k1_fe *)auStack_1990,
                       (secp256k1_fe *)auStack_1690,(secp256k1_scalar *)auStack_1c70,0);
  if (iVar179 == 0) goto LAB_00117f11;
  iVar179 = secp256k1_fe_equal_var((secp256k1_fe *)a_00,(secp256k1_fe *)__stream);
  if (iVar179 == 0) goto LAB_00117f16;
LAB_00116a13:
  lVar185 = lVar185 + 1;
  if (lVar185 == 0xd) goto code_r0x00116a25;
  goto LAB_00116850;
code_r0x00116a25:
  uStack_1cd0 = uStack_1cd0 + 1;
  if (uStack_1cd0 == 0xd) goto code_r0x00116a32;
  goto LAB_00116849;
code_r0x00116a32:
  psStack_1c88 = &ctx->error_callback;
  scratch = secp256k1_scratch_create(psStack_1c88,0x1000);
  lStack_1c80 = 0;
  auStack_1bf0._56_8_ = (void *)0x0;
  do {
    uVar205 = 0;
    do {
      lStack_1c78 = 0;
      uStack_1b68 = uVar205;
      do {
        uStack_1c38 = 0;
        do {
          bVar226 = true;
          if ((ulong)num_cores != 1) {
            auStack_1bf0._56_8_ = auStack_1bf0._56_8_ + 0xe7037ed1a0b428db;
            bVar226 = (uint32_t)
                      (((ulong)auStack_1bf0._56_8_ >> 0x20 ^ auStack_1bf0._56_8_ & 0xffffffff) *
                       (ulong)num_cores >> 0x20) == this_core;
          }
          if (bVar226) {
            puStack_1b58 = (undefined8 *)(auStack_f10 + uStack_1c38 * 0x68);
            lStack_1b60 = uStack_1c38 * lStack_1c80 + lStack_1c78;
            p_Var220 = (_func_void_char_ptr_void_ptr *)0x0;
            do {
              asStack_1390[0].ecmult_gen_ctx.built = (int)lStack_1c80;
              asStack_1390[0].ecmult_gen_ctx.blind = (int)uVar205;
              auStack_1bf0._0_4_ = (int)lStack_1c78;
              puVar206 = puStack_1b58;
              puVar225 = (undefined1 *)((long)asStack_1390 + 8);
              for (lVar185 = 0xd; lVar185 != 0; lVar185 = lVar185 + -1) {
                *(undefined8 *)puVar225 = *puVar206;
                puVar206 = puVar206 + (ulong)bVar227 * -2 + 1;
                puVar225 = (undefined1 *)((long)puVar225 + ((ulong)bVar227 * -2 + 1) * 8);
              }
              p_Stack_1b50 = p_Var220;
              puVar206 = (undefined8 *)(auStack_f10 + (long)p_Var220 * 0x68);
              puVar211 = (undefined8 *)((long)asStack_1390 + 0x70);
              for (pvVar197 = (void *)0xd; pvVar197 != (void *)0x0;
                  pvVar197 = (void *)((long)pvVar197 + -1)) {
                *puVar211 = *puVar206;
                puVar206 = puVar206 + (ulong)bVar227 * -2 + 1;
                puVar211 = puVar211 + (ulong)bVar227 * -2 + 1;
              }
              secp256k1_gej_set_infinity((secp256k1_gej *)auStack_1690);
              if (scratch == (secp256k1_scratch *)0x0) {
LAB_00116c61:
                secp256k1_ecmult_multi_simple_var
                          ((secp256k1_gej *)auStack_1690,(secp256k1_scalar *)auStack_1bf0,
                           (secp256k1_ecmult_multi_callback *)asStack_1390,pvVar197,(size_t)n_points
                          );
              }
              else {
                sVar189 = secp256k1_scratch_max_allocation(psStack_1c88,scratch,6);
                pvVar197 = (void *)0x1;
                n_points = &DAT_0012a198;
                uVar202 = 0;
                do {
                  if (pvVar197 == (void *)0xd) break;
                  iVar179 = (int)pvVar197;
                  if (iVar179 - 1U < 0xc) {
                    uVar213 = *n_points;
                  }
                  else {
                    uVar213 = 0;
                  }
                  bVar226 = false;
                  uVar201 = (ulong)(iVar179 + 0x80) / (ulong)(iVar179 + 1);
                  uVar184 = (0x98L << ((byte)pvVar197 & 0x3f)) + uVar201 * 8 + 0x110;
                  if (uVar184 <= sVar189) {
                    uVar201 = (sVar189 - uVar184) / (uVar201 * 8 + 0x100);
                    bVar226 = uVar213 <= uVar201;
                    if (!bVar226) {
                      uVar213 = uVar201;
                    }
                    if (uVar202 < uVar213) {
                      uVar202 = uVar213;
                    }
                  }
                  n_points = n_points + 1;
                  pvVar197 = (void *)((long)pvVar197 + 1);
                } while (bVar226);
                if (uVar202 == 0) goto LAB_00116c61;
                sVar189 = secp256k1_scratch_max_allocation(psStack_1c88,scratch,5);
                pvVar197 = (void *)(sVar189 - 0xe18);
                bVar226 = pvVar197 < (void *)0xfffffffffffff8f4;
                if (sVar189 < 0x70c) {
                  bVar226 = uVar202 != 1;
                }
                p_Var220 = (_func_void_char_ptr_void_ptr *)((ulong)bVar226 + 1);
                if (sVar189 < 0x70c) goto LAB_00116c61;
                pvVar197 = (void *)(ulong)(pvVar197 < (void *)0xfffffffffffff8f4);
                p_Stack_1cb8 = (_func_void_char_ptr_void_ptr *)0x2;
                puStack_1b38 = (ulong *)(2 - (long)pvVar197);
                n_points = (ulong *)0x0;
                pvStack_1b48 = pvVar197;
                p_Stack_1b40 = p_Var220;
                do {
                  num = p_Var220;
                  if (p_Stack_1cb8 < p_Var220) {
                    num = p_Stack_1cb8;
                  }
                  lVar185 = (long)n_points << ((byte)pvVar197 & 0x3f);
                  psStack_1c30 = (secp256k1_scalar *)auStack_1bf0;
                  if (n_points != (ulong *)0x0) {
                    psStack_1c30 = (secp256k1_scalar *)0x0;
                  }
                  psVar188 = (secp256k1_gej *)0x0;
                  do {
                    bVar2 = *(byte *)((long)&psVar188[0x1f05].z.magnitude + 3);
                    iVar179 = (uint)scratch->magic[(long)(psVar188->x).n] - (uint)bVar2;
                    if (scratch->magic[(long)(psVar188->x).n] != bVar2) goto LAB_00116d77;
                    psVar188 = (secp256k1_gej *)((long)(psVar188->x).n + 1);
                  } while (psVar188 != (secp256k1_gej *)0x8);
                  iVar179 = 0;
LAB_00116d77:
                  if (iVar179 == 0) {
                    uStack_1cb0 = scratch->alloc_size;
                  }
                  else {
                    (*(ctx->error_callback).fn)("invalid scratch space",(ctx->error_callback).data);
                    uStack_1cb0 = 0;
                  }
                  secp256k1_gej_set_infinity((secp256k1_gej *)auStack_1990);
                  error_callback = psStack_1c88;
                  if (p_Stack_1cb8 == (_func_void_char_ptr_void_ptr *)0x0 &&
                      n_points != (ulong *)0x0) {
                    uVar216 = 0;
                  }
                  else {
                    psVar208 = (secp256k1_gej *)
                               secp256k1_scratch_alloc(psStack_1c88,scratch,(long)num * 0x98);
                    na = (secp256k1_scalar *)
                         secp256k1_scratch_alloc(error_callback,scratch,(long)num * 4);
                    pvVar197 = secp256k1_scratch_alloc(error_callback,scratch,(long)num * 0xc0);
                    auStack_1c70._0_8_ = pvVar197;
                    pvVar190 = secp256k1_scratch_alloc(error_callback,scratch,(long)num * 0x1a0);
                    auStack_1c70._8_8_ = pvVar190;
                    pvVar191 = secp256k1_scratch_alloc(error_callback,scratch,(long)num * 0x410);
                    auStack_1c60._0_8_ = pvVar191;
                    iVar180 = (int)((ulong)psVar208 >> 0x20);
                    auVar228._0_4_ = -(uint)((int)psVar208 == 0 && iVar180 == 0);
                    auVar228._4_4_ = -(uint)((int)na == 0 && (int)((ulong)na >> 0x20) == 0);
                    auVar228._8_4_ =
                         -(uint)((int)pvVar197 == 0 && (int)((ulong)pvVar197 >> 0x20) == 0);
                    auVar228._12_4_ =
                         -(uint)((int)pvVar190 == 0 && (int)((ulong)pvVar190 >> 0x20) == 0);
                    iVar179 = movmskps((int)psVar208,auVar228);
                    psVar188 = (secp256k1_gej *)
                               CONCAT71((int7)(CONCAT44(iVar180,iVar179) >> 8),
                                        iVar179 != 0 || pvVar191 == (void *)0x0);
                    uStack_1c28 = (int)psVar188;
                    if (iVar179 == 0 && pvVar191 != (void *)0x0) {
                      if (p_Stack_1cb8 != (_func_void_char_ptr_void_ptr *)0x0) {
                        puVar203 = (uint64_t *)((long)asStack_1390 + lVar185 * 0x68 + 8);
                        p_Var220 = (_func_void_char_ptr_void_ptr *)0x0;
                        psVar188 = psVar208;
                        do {
                          na[(long)p_Var220] =
                               *(secp256k1_scalar *)
                                ((long)asStack_1390 + (long)p_Var220 * 4 + lVar185 * 4);
                          puVar204 = puVar203;
                          psVar187 = (secp256k1_ge *)auStack_1b30;
                          for (lVar195 = 0xd; lVar195 != 0; lVar195 = lVar195 + -1) {
                            (psVar187->x).n[0] = *puVar204;
                            puVar204 = puVar204 + (ulong)bVar227 * -2 + 1;
                            psVar187 = (secp256k1_ge *)((long)psVar187 + (ulong)bVar227 * -0x10 + 8)
                            ;
                          }
                          secp256k1_gej_set_ge(psVar188,(secp256k1_ge *)auStack_1b30);
                          p_Var220 = p_Var220 + 1;
                          psVar188 = psVar188 + 1;
                          puVar203 = puVar203 + 0xd;
                        } while (num != p_Var220);
                      }
                      secp256k1_ecmult_strauss_wnaf
                                ((secp256k1_strauss_state *)auStack_1c70,
                                 (secp256k1_gej *)auStack_1990,(size_t)num,psVar208,na,psStack_1c30)
                      ;
                      psVar188 = psVar208;
                    }
                    secp256k1_scratch_apply_checkpoint(psStack_1c88,scratch,uStack_1cb0);
                    p_Var220 = p_Stack_1b40;
                    pvVar197 = pvStack_1b48;
                    uVar216 = uStack_1c28;
                  }
                  if ((char)uVar216 == '\0') {
                    secp256k1_gej_add_var
                              ((secp256k1_gej *)auStack_1690,(secp256k1_gej *)auStack_1690,
                               (secp256k1_gej *)auStack_1990,&psVar188->x);
                    p_Stack_1cb8 = p_Stack_1cb8 + -(long)num;
                  }
                  n_points = (ulong *)((long)n_points + 1);
                } while ((char)uVar216 == '\0' && n_points != puStack_1b38);
              }
              p_Var220 = p_Stack_1b50;
              uVar205 = uStack_1b68;
              uVar181 = (int)p_Stack_1b50 * (int)uStack_1b68 + (int)lStack_1b60;
              ge_equals_gej((secp256k1_ge *)
                            (auStack_f10 +
                            (ulong)(uVar181 - (uVar181 / 0xd + (uVar181 / 0xd) * 0xc)) * 0x68),
                            (secp256k1_gej *)auStack_1690);
              p_Var220 = p_Var220 + 1;
            } while (p_Var220 != (_func_void_char_ptr_void_ptr *)0xd);
          }
          uStack_1c38 = uStack_1c38 + 1;
        } while (uStack_1c38 != 0xd);
        lStack_1c78 = lStack_1c78 + 1;
      } while (lStack_1c78 != 0xd);
      uVar205 = uVar205 + 1;
    } while (uVar205 != 0xd);
    lStack_1c80 = lStack_1c80 + 1;
  } while (lStack_1c80 != 0xd);
  secp256k1_scratch_destroy(psStack_1c88,scratch);
  iVar179 = 1;
  uVar202 = 0;
  do {
    iVar180 = 1;
    do {
      bVar226 = true;
      if ((ulong)num_cores != 1) {
        uVar202 = uVar202 + 0xe7037ed1a0b428db;
        bVar226 = (uint32_t)((uVar202 >> 0x20 ^ uVar202 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                  this_core;
      }
      if (bVar226) {
        auStack_1b30._0_4_ = 1;
        iVar212 = 1;
        do {
          auStack_1990 = (undefined1  [16])0x0;
          auStack_1980._0_15_ = SUB1615((undefined1  [16])0x0,0);
          auStack_1980[0xf] = (char)iVar180;
          auStack_1690 = (undefined1  [16])0x0;
          auStack_1680._0_15_ = SUB1615((undefined1  [16])0x0,0);
          auStack_1680[0xf] = (char)iVar179;
          psVar210 = ctx;
          iVar182 = secp256k1_ecdsa_sign
                              (ctx,(secp256k1_ecdsa_signature *)asStack_1390,auStack_1690,
                               auStack_1990,secp256k1_nonce_function_smallint,auStack_1b30);
          if (iVar182 != 1) {
            main_cold_8();
LAB_00117efd:
            main_cold_9();
LAB_00117f02:
            main_cold_10();
            goto LAB_00117f07;
          }
          lVar185 = 0;
          uVar181 = 0;
          do {
            uVar193 = (uint)*(byte *)((long)asStack_1390 + lVar185) | uVar181 << 8;
            uVar181 = uVar193 - (uVar193 / 0xd + (uVar193 / 0xd) * 0xc);
            if (uVar193 < 0xd) {
              uVar181 = uVar193;
            }
            lVar185 = lVar185 + 1;
          } while (lVar185 != 0x20);
          uVar193 = 0;
          lVar185 = 0x20;
          do {
            uVar194 = (uint)*(byte *)((long)asStack_1390 + lVar185) | uVar193 << 8;
            uVar193 = uVar194 - (uVar194 / 0xd + (uVar194 / 0xd) * 0xc);
            if (uVar194 < 0xd) {
              uVar193 = uVar194;
            }
            lVar185 = lVar185 + 1;
          } while (lVar185 != 0x40);
          psVar210 = (secp256k1_context *)auStack_1c70;
          r_from_k((secp256k1_scalar *)psVar210,(secp256k1_ge *)auStack_f10,auStack_1b30._0_4_,
                   (int *)(ulong)uVar194);
          if (uVar181 != auStack_1c70._0_4_) goto LAB_00117efd;
          uVar216 = auStack_1b30._0_4_;
          uVar194 = auStack_1b30._0_4_ * uVar193;
          uVar181 = uVar181 * iVar180 + iVar179;
          iVar182 = uVar181 - (uVar181 / 0xd + (uVar181 / 0xd) * 0xc);
          if ((uVar194 - (uVar194 / 0xd + (uVar194 / 0xd) * 0xc) != iVar182) &&
             (uVar181 = (0xd - uVar193) * auStack_1b30._0_4_,
             uVar181 - (uVar181 / 0xd + (uVar181 / 0xd) * 0xc) != iVar182)) goto LAB_00117f02;
          if ((int)auStack_1b30._0_4_ < iVar212) break;
          iVar212 = auStack_1b30._0_4_ + 1;
          auStack_1b30._0_4_ = iVar212;
        } while ((int)uVar216 < 0xc);
      }
      iVar180 = iVar180 + 1;
    } while (iVar180 != 0xd);
    iVar179 = iVar179 + 1;
  } while (iVar179 != 0xd);
  uVar181 = 1;
  uStack_1cd0._0_4_ = -1;
  uVar202 = 0;
  do {
    uVar213 = 1;
    iVar179 = 2;
    do {
      iVar180 = 1;
      psStack_1c30 = (secp256k1_scalar *)CONCAT44(psStack_1c30._4_4_,iVar179);
      do {
        lVar185 = 1;
        a_00 = (secp256k1_context *)(uVar213 & 0xffffffff);
        iVar212 = iVar179;
        do {
          bVar226 = true;
          if ((ulong)num_cores != 1) {
            uVar202 = uVar202 + 0xe7037ed1a0b428db;
            bVar226 = (uint32_t)
                      ((uVar202 >> 0x20 ^ uVar202 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                      this_core;
          }
          if (bVar226) {
            uVar193 = iVar212 - ((int)((ulong)a_00 / 0xd) + (int)((ulong)a_00 / 0xd) * 0xc);
            piVar198 = (int *)(ulong)((uVar193 / 0xd) * 3);
            iVar223 = uVar193 - (uVar193 / 0xd + (uVar193 / 0xd) * 0xc);
            uVar201 = 0;
            uVar193 = 0;
            iVar182 = 0;
            do {
              r_from_k((secp256k1_scalar *)asStack_1390,(secp256k1_ge *)auStack_f10,iVar182,piVar198
                      );
              if (uVar213 == (asStack_1390[0].ecmult_gen_ctx._0_8_ & 0xffffffff)) {
                bVar226 = (int)(uVar201 / 0xd) + (int)(uVar201 / 0xd) * 0xc + iVar223 == 0;
                piVar198 = (int *)(ulong)bVar226;
                uVar193 = uVar193 | bVar226;
              }
              iVar182 = iVar182 + 1;
              iVar223 = iVar223 + (int)uStack_1cd0;
              uVar201 = (ulong)((int)uVar201 + uVar181);
            } while (iVar182 != 0xd);
            auStack_1690 = (undefined1  [16])0x0;
            auStack_1680._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1680[0xf] = (char)uVar213;
            auStack_1670 = (undefined1  [16])0x0;
            auStack_1660._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1660[0xf] = (char)uVar181;
            puVar206 = (undefined8 *)(auStack_f10 + lVar185 * 0x68);
            psVar187 = (secp256k1_ge *)asStack_1390;
            for (lVar195 = 0xd; lVar195 != 0; lVar195 = lVar195 + -1) {
              (psVar187->x).n[0] = *puVar206;
              puVar206 = puVar206 + (ulong)bVar227 * -2 + 1;
              psVar187 = (secp256k1_ge *)((long)psVar187 + (ulong)bVar227 * -0x10 + 8);
            }
            secp256k1_ge_to_storage
                      ((secp256k1_ge_storage *)auStack_1990,(secp256k1_ge *)asStack_1390);
            auStack_1b00._8_8_ = auStack_1960._8_8_;
            auStack_1b00._0_8_ = auStack_1960._0_8_;
            auStack_1b10._8_4_ = (int)uStack_1968;
            auStack_1b10._0_8_ = uStack_1970;
            auStack_1b10._12_4_ = uStack_1968._4_4_;
            auStack_1b20 = auStack_1980;
            auStack_1b30 = auStack_1990;
            auStack_1990 = (undefined1  [16])0x0;
            auStack_1980._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1980[0xf] = (char)iVar180;
            uVar194 = secp256k1_ecdsa_verify
                                (ctx,(secp256k1_ecdsa_signature *)auStack_1690,(uchar *)auStack_1990
                                 ,(secp256k1_pubkey *)auStack_1b30);
            if ((uVar181 < 7 & uVar193) != uVar194) goto LAB_00117f39;
          }
          lVar185 = lVar185 + 1;
          iVar212 = iVar212 + (int)uVar213;
          a_00 = (secp256k1_context *)(ulong)(uint)((int)a_00 + (int)uVar213);
        } while (lVar185 != 0xd);
        iVar180 = iVar180 + 1;
        iVar179 = iVar179 + 1;
      } while (iVar180 != 0xd);
      uVar213 = uVar213 + 1;
      iVar179 = (int)psStack_1c30 + 1;
    } while (uVar213 != 0xd);
    uVar181 = uVar181 + 1;
    uStack_1cd0._0_4_ = (int)uStack_1cd0 + -1;
  } while (uVar181 != 0xd);
  uVar202 = 1;
  puVar225 = auStack_19d0;
  puVar221 = auStack_1b30;
  do {
    auStack_1c20 = (undefined1  [16])0x0;
    auStack_1c10._0_15_ = SUB1615((undefined1  [16])0x0,0);
    auStack_1c10[0xf] = (char)uVar202;
    lVar195 = uVar202 - 1;
    lVar185 = (long)asStack_1390 + (uVar202 * 2 + -3) * 0x30 + 0x30;
    psVar210 = ctx;
    iVar179 = secp256k1_keypair_create(ctx,(secp256k1_keypair *)lVar185,auStack_1c20);
    if (iVar179 == 0) goto LAB_00117f7f;
    psVar210 = ctx;
    iVar179 = secp256k1_ec_pubkey_create
                        (ctx,(secp256k1_pubkey *)(auStack_1990 + lVar195 * 0x40),auStack_1c20);
    if (iVar179 == 0) goto LAB_00117f84;
    psVar222 = (secp256k1_xonly_pubkey *)(auStack_1690 + lVar195 * 0x40);
    pk_parity = (uint *)(auStack_1c70 + lVar195 * 4);
    psVar210 = ctx;
    iVar179 = secp256k1_keypair_xonly_pub
                        (ctx,psVar222,(int *)pk_parity,(secp256k1_keypair *)lVar185);
    if (iVar179 == 0) goto LAB_00117f89;
    puVar219 = auStack_1b30 + lVar195 * 0x20;
    psVar210 = ctx;
    iVar179 = secp256k1_xonly_pubkey_serialize(ctx,puVar219,psVar222);
    if (iVar179 == 0) goto LAB_00117f8e;
    psVar210 = ctx;
    iVar179 = secp256k1_xonly_pubkey_parse(ctx,psVar222,puVar219);
    if (iVar179 == 0) goto LAB_00117f93;
    psVar210 = ctx;
    iVar179 = secp256k1_xonly_pubkey_serialize(ctx,auStack_1c20,psVar222);
    if (iVar179 == 0) goto LAB_00117f98;
    lVar185 = 0;
    do {
      bVar2 = auStack_1c20[lVar185];
      psVar210 = (secp256k1_context *)(ulong)bVar2;
      iVar179 = (uint)(byte)puVar221[lVar185] - (uint)bVar2;
      if (puVar221[lVar185] != bVar2) goto LAB_0011761b;
      lVar185 = lVar185 + 1;
    } while (lVar185 != 0x20);
    iVar179 = 0;
LAB_0011761b:
    if (iVar179 != 0) goto LAB_00117f9d;
    psVar210 = ctx;
    iVar179 = secp256k1_xonly_pubkey_from_pubkey
                        (ctx,psVar222,(int *)auStack_1b90,
                         (secp256k1_pubkey *)(auStack_1990 + lVar195 * 0x40));
    if (iVar179 == 0) goto LAB_00117fa2;
    if (auStack_1b90._0_4_ != *pk_parity) goto LAB_00117fa7;
    psVar210 = ctx;
    iVar179 = secp256k1_xonly_pubkey_serialize(ctx,auStack_1c20,psVar222);
    if (iVar179 == 0) goto LAB_00117fac;
    lVar185 = 0;
    a_00 = (secp256k1_context *)auStack_1bf0;
    do {
      bVar2 = auStack_1c20[lVar185];
      psVar210 = (secp256k1_context *)(ulong)bVar2;
      iVar179 = (uint)(byte)puVar221[lVar185] - (uint)bVar2;
      if (puVar221[lVar185] != bVar2) goto LAB_001176a5;
      lVar185 = lVar185 + 1;
    } while (lVar185 != 0x20);
    iVar179 = 0;
LAB_001176a5:
    if (iVar179 != 0) goto LAB_00117fb1;
    secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)a_00,puVar219);
    auStack_1bf0._40_8_ = (void *)0x1;
    secp256k1_fe_verify((secp256k1_fe *)a_00);
    lVar185 = uVar202 * 0x68;
    psVar210 = a_00;
    iVar179 = secp256k1_fe_equal_var((secp256k1_fe *)a_00,(secp256k1_fe *)(auStack_f10 + lVar185));
    if (iVar179 == 0) goto LAB_00117fb6;
    auStack_1bf0._0_8_ = *(undefined8 *)(auStack_f10 + lVar185 + 0x30);
    auStack_1bf0._8_8_ = *(undefined8 *)(auStack_f10 + lVar185 + 0x38);
    auStack_1bf0._16_8_ = *(undefined8 *)(auStack_f10 + lVar185 + 0x40);
    auStack_1bf0._24_8_ = *(undefined8 *)(auStack_f10 + lVar185 + 0x48);
    auStack_1bf0._32_4_ = *(undefined4 *)(auStack_f10 + lVar185 + 0x50);
    auStack_1bf0._36_4_ = *(undefined4 *)(auStack_f10 + lVar185 + 0x54);
    auStack_1bf0._44_4_ = *(undefined4 *)(auStack_f10 + lVar185 + 0x5c);
    auStack_1bf0._40_4_ = *(undefined4 *)(auStack_f10 + lVar185 + 0x58);
    secp256k1_fe_normalize_var((secp256k1_fe *)a_00);
    secp256k1_fe_verify((secp256k1_fe *)a_00);
    if (auStack_1bf0._44_4_ == 0) goto LAB_00117fbb;
    if ((auStack_1bf0._0_4_ & 1) != *pk_parity) goto LAB_00117fc0;
    if (6 < uVar202) {
      lVar185 = 0;
      psVar210 = extraout_RDX;
      do {
        a_00 = (secp256k1_context *)((ulong)psVar210 & 0xffffffff);
        bVar2 = puVar221[lVar185];
        bVar3 = puVar225[lVar185];
        psVar210 = (secp256k1_context *)(ulong)((uint)bVar2 - (uint)bVar3);
        if (bVar2 == bVar3) {
          psVar210 = a_00;
        }
        iVar179 = (int)psVar210;
        if (bVar2 != bVar3) goto LAB_00117784;
        lVar185 = lVar185 + 1;
      } while (lVar185 != 0x20);
      iVar179 = 0;
LAB_00117784:
      if (iVar179 != 0) goto LAB_00117fd9;
      if (*pk_parity != 1U - *(int *)(auStack_1c70 + (0xc - uVar202) * 4)) goto LAB_00117fde;
    }
    uVar202 = uVar202 + 1;
    puVar221 = puVar221 + 0x20;
    puVar225 = puVar225 + -0x20;
  } while (uVar202 != 0xd);
  lVar185 = 0;
  do {
    a_00 = ctx;
    iVar179 = secp256k1_xonly_pubkey_parse
                        (ctx,(secp256k1_xonly_pubkey *)asStack_1390,
                         invalid_pubkey_bytes[0] + lVar185);
    if (iVar179 != 0) goto LAB_00117fc5;
    lVar185 = lVar185 + 0x20;
    keypair = (secp256k1_keypair *)asStack_1390;
  } while (lVar185 != 0xe0);
  lVar185 = -0xc;
  psVar222 = (secp256k1_xonly_pubkey *)auStack_1990;
  piVar198 = (int *)auStack_1bf0;
  puVar219 = auStack_1690;
  do {
    auStack_1b30 = (undefined1  [16])0x0;
    auStack_1b20._0_15_ = SUB1615((undefined1  [16])0x0,0);
    auStack_1b20[0xf] = (char)lVar185 + '\r';
    a_00 = ctx;
    iVar179 = secp256k1_keypair_create(ctx,keypair,auStack_1b30);
    if (iVar179 == 0) goto LAB_00117fca;
    a_00 = ctx;
    iVar179 = secp256k1_keypair_xonly_pub(ctx,psVar222,piVar198,keypair);
    if (iVar179 == 0) goto LAB_00117fcf;
    a_00 = ctx;
    iVar179 = secp256k1_xonly_pubkey_serialize(ctx,puVar219,psVar222);
    if (iVar179 == 0) goto LAB_00117fd4;
    puVar219 = puVar219 + 0x20;
    piVar198 = piVar198 + 1;
    psVar222 = psVar222 + 1;
    keypair = (secp256k1_keypair *)(keypair->data + 0x60);
    lVar185 = lVar185 + 1;
  } while (lVar185 != 0);
  sStack_1bb0.ndata = (int *)0x0;
  sStack_1bb0.magic[0] = 0xda;
  sStack_1bb0.magic[1] = 'o';
  sStack_1bb0.magic[2] = 0xb3;
  sStack_1bb0.magic[3] = 0x8c;
  sStack_1bb0._4_4_ = 0;
  sStack_1bb0.noncefp = (secp256k1_nonce_function_hardened)0x0;
  lVar185 = 1;
  uStack_1cd0 = 0;
  do {
    iVar179 = 0xd - (int)lVar185;
    if ((&iStack_1bf4)[lVar185] == 0) {
      iVar179 = (int)lVar185;
    }
    iStack_1c8c = 1;
    do {
      auStack_1c50 = (undefined1  [16])0x0;
      auStack_1c60 = (undefined1  [16])0x0;
      auStack_1c70 = (undefined1  [16])0x0;
      iStack_1c40 = 0;
      bVar226 = true;
      if ((ulong)num_cores != 1) {
        uStack_1cd0 = uStack_1cd0 + 0xe7037ed1a0b428db;
        bVar226 = (uint32_t)
                  ((uStack_1cd0 >> 0x20 ^ uStack_1cd0 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                  this_core;
      }
      if (bVar226) {
        sStack_1bb0.noncefp = secp256k1_hardened_nonce_function_smallint;
        sStack_1bb0.ndata = &iStack_1c8c;
        iVar180 = 0xd - iStack_1c8c;
        if ((&iStack_1bf4)[iStack_1c8c] == 0) {
          iVar180 = iStack_1c8c;
        }
        iVar212 = 0;
        do {
          secp256k1_testrand256(auStack_1c20);
          secp256k1_schnorrsig_challenge
                    (&uStack_1c24,abStack_16b0 + (long)iStack_1c8c * 0x20,auStack_1c20,0x20,
                     auStack_1690 + (lVar185 + -1) * 0x20);
          uVar202 = (ulong)uStack_1c24;
          if (*(int *)(auStack_1c70 + uVar202 * 4) == 0) {
            uVar181 = uStack_1c24 * iVar179 + iVar180;
            auStack_1b90 = (undefined1  [16])0x0;
            auStack_1b80._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1b80[0xf] =
                 (char)uVar181 - ((char)(uVar181 / 0xd) + (char)(uVar181 / 0xd) * '\f');
            a_00 = ctx;
            iVar182 = secp256k1_schnorrsig_sign_custom
                                (ctx,auStack_1b30,auStack_1c20,0x20,
                                 (secp256k1_keypair *)
                                 ((long)asStack_1390 + (lVar185 * 2 + -3) * 0x30 + 0x30U),
                                 &sStack_1bb0);
            if (iVar182 == 0) goto LAB_00117f61;
            pbVar199 = abStack_16b0;
            pbVar192 = pbVar199 + (long)iStack_1c8c * 0x20;
            lVar195 = 0;
            do {
              pbVar207 = (byte *)((ulong)pbVar199 & 0xffffffff);
              bVar2 = auStack_1b30[lVar195];
              a_00 = (secp256k1_context *)(ulong)bVar2;
              bVar3 = pbVar192[lVar195];
              pbVar199 = (byte *)(ulong)((uint)bVar2 - (uint)bVar3);
              if (bVar2 == bVar3) {
                pbVar199 = pbVar207;
              }
              iVar182 = (int)pbVar199;
              if (bVar2 != bVar3) goto LAB_00117aa3;
              lVar195 = lVar195 + 1;
            } while (lVar195 != 0x20);
            iVar182 = 0;
LAB_00117aa3:
            if (iVar182 != 0) goto LAB_00117f66;
            lVar195 = 0;
            do {
              pbVar199 = (byte *)((ulong)pbVar192 & 0xffffffff);
              bVar2 = auStack_1b10[lVar195];
              bVar3 = auStack_1b90[lVar195];
              a_00 = (secp256k1_context *)(ulong)bVar3;
              pbVar192 = (byte *)(ulong)((uint)bVar2 - (uint)bVar3);
              if (bVar2 == bVar3) {
                pbVar192 = pbVar199;
              }
              iVar182 = (int)pbVar192;
              if (bVar2 != bVar3) goto LAB_00117ad6;
              lVar195 = lVar195 + 1;
            } while (lVar195 != 0x20);
            iVar182 = 0;
LAB_00117ad6:
            if (iVar182 != 0) goto LAB_00117f6b;
            *(undefined4 *)(auStack_1c70 + uVar202 * 4) = 1;
            iVar212 = iVar212 + 1;
          }
        } while (iVar212 < 0xd);
      }
      iVar180 = iStack_1c8c + 1;
      bVar226 = iStack_1c8c < 0xc;
      iStack_1c8c = iVar180;
    } while (bVar226);
    lVar185 = lVar185 + 1;
  } while (lVar185 != 0xd);
  psStack_1c98 = (secp256k1_gej *)0x1;
  uStack_1cb0 = 0;
  do {
    lVar185 = ((long)psStack_1c98 + -1) * 0x20;
    auStack_1c10 = *(undefined1 (*) [16])(auStack_1680 + lVar185);
    iVar179 = 0xd - (int)psStack_1c98;
    if ((&iStack_1bf4)[(long)psStack_1c98] == 0) {
      iVar179 = (int)psStack_1c98;
    }
    auStack_1c20._8_8_ = *(undefined8 *)(auStack_1690 + lVar185 + 8);
    auStack_1c20._0_8_ = *(undefined8 *)(auStack_1690 + lVar185);
    puStack_1cc8 = (undefined1 *)0x1;
    do {
      auStack_1c50 = (undefined1  [16])0x0;
      auStack_1c60 = (undefined1  [16])0x0;
      auStack_1c70 = (undefined1  [16])0x0;
      iStack_1c40 = 0;
      bVar226 = true;
      if ((ulong)num_cores != 1) {
        uStack_1cb0 = uStack_1cb0 + 0xe7037ed1a0b428db;
        bVar226 = (uint32_t)
                  ((uStack_1cb0 >> 0x20 ^ uStack_1cb0 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                  this_core;
      }
      if (bVar226) {
        iVar180 = (int)puStack_1cc8;
        if (puStack_1cc8 < 7) {
          lVar185 = ((long)puStack_1cc8 - 1U) * 0x20;
          auStack_1b20 = *(undefined1 (*) [16])(auStack_1680 + lVar185);
          auStack_1b30._8_8_ = *(undefined8 *)(auStack_1690 + lVar185 + 8);
          auStack_1b30._0_8_ = *(undefined8 *)(auStack_1690 + lVar185);
          iVar212 = 0xd - iVar180;
          if ((&iStack_1bf4)[(long)puStack_1cc8] == 0) {
            iVar212 = iVar180;
          }
        }
        else {
          auStack_1b30 = *(undefined1 (*) [16])invalid_pubkey_bytes[iVar180 - 7U];
          auStack_1b20 = *(undefined1 (*) [16])(invalid_pubkey_bytes[iVar180 - 7U] + 0x10);
          iVar212 = -1;
        }
        iVar180 = 0;
        do {
          secp256k1_testrand256(auStack_1b90);
          secp256k1_schnorrsig_challenge
                    ((secp256k1_scalar *)&sStack_1bb0,auStack_1b30,auStack_1b90,0x20,auStack_1c20);
          uVar202 = sStack_1bb0._0_8_ & 0xffffffff;
          if (*(int *)(auStack_1c70 + uVar202 * 4) == 0) {
            uVar181 = (int)sStack_1bb0.magic * iVar179 + iVar212;
            iVar182 = 0;
            uVar193 = 0;
            do {
              if (iVar182 == 0xe) {
                secp256k1_testrand256(auStack_1b10);
                uVar194 = 0;
              }
              else {
                auStack_1b10 = (undefined1  [16])0x0;
                auStack_1b00._0_15_ = SUB1615((undefined1  [16])0x0,0);
                auStack_1b00[0xf] = (char)iVar182;
                uVar194 = 0;
                if (iVar182 != 0xd && iVar212 != -1) {
                  uVar194 = (uint)(uVar181 - (uVar181 / 0xd + (uVar181 / 0xd) * 0xc) == iVar182);
                }
              }
              a_00 = ctx;
              uVar183 = secp256k1_schnorrsig_verify
                                  (ctx,auStack_1b30,auStack_1b90,0x20,
                                   (secp256k1_xonly_pubkey *)
                                   (auStack_1990 + ((long)psStack_1c98 + -1) * 0x40));
              if (uVar183 != uVar194) goto LAB_00117f70;
              uVar193 = uVar193 + uVar183;
              iVar182 = iVar182 + 1;
            } while (iVar182 != 0xf);
            if (uVar193 != (iVar212 != -1)) goto LAB_00117fe3;
            *(undefined4 *)(auStack_1c70 + uVar202 * 4) = 1;
            iVar180 = iVar180 + 1;
          }
        } while (iVar180 < 0xd);
      }
      puStack_1cc8 = (undefined1 *)((long)puStack_1cc8 + 1);
    } while (puStack_1cc8 != (undefined1 *)0xe);
    psStack_1c98 = (secp256k1_gej *)((long)psStack_1c98 + 1);
  } while (psStack_1c98 != (secp256k1_gej *)0x7);
  lVar185 = -0xc;
  psVar187 = (secp256k1_ge *)(auStack_f10 + 0x68);
  do {
    auStack_1b30 = (undefined1  [16])0x0;
    auStack_1b20._0_15_ = SUB1615((undefined1  [16])0x0,0);
    auStack_1b20[0xf] = (char)lVar185 + '\r';
    a_00 = ctx;
    iVar179 = secp256k1_ellswift_create(ctx,auStack_1990,auStack_1b30,(uchar *)0x0);
    if (iVar179 == 0) goto LAB_00117fe8;
    secp256k1_ellswift_decode(ctx,(secp256k1_pubkey *)auStack_1690,auStack_1990);
    secp256k1_pubkey_load(ctx,(secp256k1_ge *)asStack_1390,(secp256k1_pubkey *)auStack_1690);
    ge_equals_ge((secp256k1_ge *)asStack_1390,psVar187);
    psVar187 = (secp256k1_ge *)((long)(&psVar187->x + 2) + 8);
    lVar185 = lVar185 + 1;
  } while (lVar185 != 0);
  secp256k1_context_destroy(ctx);
  psStack_1c98 = (secp256k1_gej *)0x7;
  iVar179 = count;
  goto joined_r0x001160d6;
LAB_00117f07:
  main_cold_43();
LAB_00117f0c:
  main_cold_42();
LAB_00117f11:
  a_00 = psVar210;
  main_cold_39();
LAB_00117f16:
  main_cold_38();
LAB_00117f1b:
  main_cold_4();
LAB_00117f20:
  main_cold_5();
LAB_00117f25:
  main_cold_47();
LAB_00117f2a:
  main_cold_46();
LAB_00117f2f:
  main_cold_6();
LAB_00117f34:
  main_cold_7();
LAB_00117f39:
  main_cold_11();
LAB_00117f3e:
  main_cold_41();
LAB_00117f43:
  main_cold_51();
LAB_00117f48:
  main_cold_50();
LAB_00117f4d:
  main_cold_3();
LAB_00117f52:
  main_cold_48();
LAB_00117f57:
  main_cold_45();
LAB_00117f5c:
  main_cold_44();
LAB_00117f61:
  main_cold_24();
LAB_00117f66:
  main_cold_19();
LAB_00117f6b:
  main_cold_20();
LAB_00117f70:
  main_cold_21();
  psVar210 = a_00;
  goto LAB_00117f75;
}

Assistant:

static int secp256k1_ecmult_const_xonly(secp256k1_fe* r, const secp256k1_fe *n, const secp256k1_fe *d, const secp256k1_scalar *q, int known_on_curve) {

    /* This algorithm is a generalization of Peter Dettman's technique for
     * avoiding the square root in a random-basepoint x-only multiplication
     * on a Weierstrass curve:
     * https://mailarchive.ietf.org/arch/msg/cfrg/7DyYY6gg32wDgHAhgSb6XxMDlJA/
     *
     *
     * === Background: the effective affine technique ===
     *
     * Let phi_u be the isomorphism that maps (x, y) on secp256k1 curve y^2 = x^3 + 7 to
     * x' = u^2*x, y' = u^3*y on curve y'^2 = x'^3 + u^6*7. This new curve has the same order as
     * the original (it is isomorphic), but moreover, has the same addition/doubling formulas, as
     * the curve b=7 coefficient does not appear in those formulas (or at least does not appear in
     * the formulas implemented in this codebase, both affine and Jacobian). See also Example 9.5.2
     * in https://www.math.auckland.ac.nz/~sgal018/crypto-book/ch9.pdf.
     *
     * This means any linear combination of secp256k1 points can be computed by applying phi_u
     * (with non-zero u) on all input points (including the generator, if used), computing the
     * linear combination on the isomorphic curve (using the same group laws), and then applying
     * phi_u^{-1} to get back to secp256k1.
     *
     * Switching to Jacobian coordinates, note that phi_u applied to (X, Y, Z) is simply
     * (X, Y, Z/u). Thus, if we want to compute (X1, Y1, Z) + (X2, Y2, Z), with identical Z
     * coordinates, we can use phi_Z to transform it to (X1, Y1, 1) + (X2, Y2, 1) on an isomorphic
     * curve where the affine addition formula can be used instead.
     * If (X3, Y3, Z3) = (X1, Y1) + (X2, Y2) on that curve, then our answer on secp256k1 is
     * (X3, Y3, Z3*Z).
     *
     * This is the effective affine technique: if we have a linear combination of group elements
     * to compute, and all those group elements have the same Z coordinate, we can simply pretend
     * that all those Z coordinates are 1, perform the computation that way, and then multiply the
     * original Z coordinate back in.
     *
     * The technique works on any a=0 short Weierstrass curve. It is possible to generalize it to
     * other curves too, but there the isomorphic curves will have different 'a' coefficients,
     * which typically does affect the group laws.
     *
     *
     * === Avoiding the square root for x-only point multiplication ===
     *
     * In this function, we want to compute the X coordinate of q*(n/d, y), for
     * y = sqrt((n/d)^3 + 7). Its negation would also be a valid Y coordinate, but by convention
     * we pick whatever sqrt returns (which we assume to be a deterministic function).
     *
     * Let g = y^2*d^3 = n^3 + 7*d^3. This also means y = sqrt(g/d^3).
     * Further let v = sqrt(d*g), which must exist as d*g = y^2*d^4 = (y*d^2)^2.
     *
     * The input point (n/d, y) also has Jacobian coordinates:
     *
     *     (n/d, y, 1)
     *   = (n/d * v^2, y * v^3, v)
     *   = (n/d * d*g, y * sqrt(d^3*g^3), v)
     *   = (n/d * d*g, sqrt(y^2 * d^3*g^3), v)
     *   = (n*g, sqrt(g/d^3 * d^3*g^3), v)
     *   = (n*g, sqrt(g^4), v)
     *   = (n*g, g^2, v)
     *
     * It is easy to verify that both (n*g, g^2, v) and its negation (n*g, -g^2, v) have affine X
     * coordinate n/d, and this holds even when the square root function doesn't have a
     * deterministic sign. We choose the (n*g, g^2, v) version.
     *
     * Now switch to the effective affine curve using phi_v, where the input point has coordinates
     * (n*g, g^2). Compute (X, Y, Z) = q * (n*g, g^2) there.
     *
     * Back on secp256k1, that means q * (n*g, g^2, v) = (X, Y, v*Z). This last point has affine X
     * coordinate X / (v^2*Z^2) = X / (d*g*Z^2). Determining the affine Y coordinate would involve
     * a square root, but as long as we only care about the resulting X coordinate, no square root
     * is needed anywhere in this computation.
     */

    secp256k1_fe g, i;
    secp256k1_ge p;
    secp256k1_gej rj;

    /* Compute g = (n^3 + B*d^3). */
    secp256k1_fe_sqr(&g, n);
    secp256k1_fe_mul(&g, &g, n);
    if (d) {
        secp256k1_fe b;
#ifdef VERIFY
        VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero(d));
#endif
        secp256k1_fe_sqr(&b, d);
        VERIFY_CHECK(SECP256K1_B <= 8); /* magnitude of b will be <= 8 after the next call */
        secp256k1_fe_mul_int(&b, SECP256K1_B);
        secp256k1_fe_mul(&b, &b, d);
        secp256k1_fe_add(&g, &b);
        if (!known_on_curve) {
            /* We need to determine whether (n/d)^3 + 7 is square.
             *
             *     is_square((n/d)^3 + 7)
             * <=> is_square(((n/d)^3 + 7) * d^4)
             * <=> is_square((n^3 + 7*d^3) * d)
             * <=> is_square(g * d)
             */
            secp256k1_fe c;
            secp256k1_fe_mul(&c, &g, d);
            if (!secp256k1_fe_is_square_var(&c)) return 0;
        }
    } else {
        secp256k1_fe_add_int(&g, SECP256K1_B);
        if (!known_on_curve) {
            /* g at this point equals x^3 + 7. Test if it is square. */
            if (!secp256k1_fe_is_square_var(&g)) return 0;
        }
    }

    /* Compute base point P = (n*g, g^2), the effective affine version of (n*g, g^2, v), which has
     * corresponding affine X coordinate n/d. */
    secp256k1_fe_mul(&p.x, &g, n);
    secp256k1_fe_sqr(&p.y, &g);
    p.infinity = 0;

    /* Perform x-only EC multiplication of P with q. */
#ifdef VERIFY
    VERIFY_CHECK(!secp256k1_scalar_is_zero(q));
#endif
    secp256k1_ecmult_const(&rj, &p, q);
#ifdef VERIFY
    VERIFY_CHECK(!secp256k1_gej_is_infinity(&rj));
#endif

    /* The resulting (X, Y, Z) point on the effective-affine isomorphic curve corresponds to
     * (X, Y, Z*v) on the secp256k1 curve. The affine version of that has X coordinate
     * (X / (Z^2*d*g)). */
    secp256k1_fe_sqr(&i, &rj.z);
    secp256k1_fe_mul(&i, &i, &g);
    if (d) secp256k1_fe_mul(&i, &i, d);
    secp256k1_fe_inv(&i, &i);
    secp256k1_fe_mul(r, &rj.x, &i);

    return 1;
}